

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

void __thiscall
MakefileGenerator::writeInstalls(MakefileGenerator *this,QTextStream *t,bool noBuild)

{
  byte bVar1;
  QMakeProject *pQVar2;
  ProStringList l;
  QString string;
  QString string_00;
  QString file;
  QString file_00;
  QString string_01;
  QString file_01;
  int *piVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  QHash<ProKey,_ProFunctionDef> QVar10;
  char cVar11;
  bool bVar12;
  char cVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  longlong __old_val;
  ProStringList *pPVar17;
  QList<ProString> *vector;
  qsizetype qVar18;
  ProStringList *pPVar19;
  QArrayDataPointer<ProString> *other;
  iterator iVar20;
  iterator iVar21;
  Node<QString,_QHashDummyValue> *pNVar22;
  pointer pQVar23;
  QTextStream *pQVar24;
  QMakeProject *pQVar25;
  ulong uVar26;
  long lVar27;
  MakefileGenerator *pMVar28;
  MakefileGenerator *pMVar29;
  char *pcVar30;
  longlong lVar31;
  QMakeProject *pQVar32;
  QMakeProject *pQVar33;
  QMakeProject *pQVar34;
  ProString *this_00;
  long lVar35;
  Data *pDVar36;
  long in_FS_OFFSET;
  QByteArrayView QVar37;
  QStringView QVar38;
  QAnyStringView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QStringView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QLatin1String QVar51;
  QStringView QVar52;
  QStringView config;
  QLatin1String QVar53;
  QStringView config_00;
  QStringView config_01;
  QLatin1String QVar54;
  QStringView config_02;
  QStringView config_03;
  QFileInfo fi;
  QFileInfo fi_1;
  ProKey pvar;
  QMakeProject *in_stack_fffffffffffffa58;
  ProString *local_590;
  QMakeProject *local_558;
  QMakeProject *local_548;
  ProString *local_520;
  QStringBuilder<QString_&,_QString_&> local_510;
  undefined1 local_500 [24];
  QString local_4e8;
  ProKey local_4d0;
  QString local_4a0;
  undefined1 local_488 [32];
  QString local_468;
  QString local_450;
  QString local_438;
  ProKey local_418;
  QString local_3e8;
  QStringBuilder<QString,_QString> local_3c8;
  undefined1 local_398 [24];
  Data *local_380;
  QMakeProject *pQStack_378;
  QMakeProject *local_370;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  QStack_368;
  QString local_358;
  ProKey local_340;
  QMakeProject *local_310;
  Data *local_308;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  QStack_300;
  undefined1 local_2f8 [40];
  QHash<ReplaceExtraCompilerCacheKey,_QString> QStack_2d0;
  QMakeProject *local_2c8;
  QString local_2b8;
  undefined1 local_298 [16];
  totally_ordered_wrapper<QMakeFeatureRoots_*> local_288;
  undefined1 local_278 [16];
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  local_268;
  undefined1 local_258 [16];
  QMakeProject *local_248;
  QString local_238;
  QString local_218;
  QArrayDataPointer<ProString> local_200;
  QArrayDataPointer<ProString> local_1e8;
  QArrayDataPointer<QString> local_1c8;
  QArrayDataPointer<QString> local_1a8;
  QArrayDataPointer<QString> local_188;
  QString local_168;
  QString local_148;
  undefined1 local_128 [32];
  ProString *local_108;
  QString *pQStack_100;
  QHash<QString,_QHashDummyValue> local_f8;
  QHash<QString,_QHashDummyValue> local_f0;
  QString local_e8;
  QString local_c8;
  undefined1 local_a8 [16];
  QHash<ProKey,_ProFunctionDef> local_98;
  undefined1 local_88 [16];
  QHash<ProKey,_ProFunctionDef> local_78;
  QMakeProject *pQStack_70;
  QMakeProject *pQStack_68;
  QMakeProject *local_60;
  ProValueMap PStack_58;
  QMakeProject *local_50;
  QMakeProject *pQStack_48;
  QMakeProject *local_40;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QVar37.m_data = &DAT_0000000c;
  QVar37.m_size = (qsizetype)local_88;
  QString::fromUtf8(QVar37);
  local_a8._0_8_ = local_88._0_8_;
  local_a8._8_8_ = local_88._8_8_;
  local_98.d = local_78.d;
  if ((Option::dir_sep.d.size != 1) ||
     (QVar38.m_data = Option::dir_sep.d.ptr, QVar38.m_size = 1, QVar51.m_data = "\\",
     QVar51.m_size = 1, cVar11 = QtPrivate::equalStrings(QVar38,QVar51), cVar11 == '\0')) {
    QVar39.m_size = (size_t)"-$(DEL_FILE) -r";
    QVar39.field_0.m_data = local_a8;
    QString::assign(QVar39);
  }
  local_c8.d.d = (Data *)0x0;
  local_c8.d.ptr = (char16_t *)0x0;
  local_c8.d.size = 0;
  local_e8.d.d = (Data *)0x0;
  local_e8.d.ptr = (char16_t *)0x0;
  local_e8.d.size = 0;
  local_f0.d = (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0;
  local_f8.d = (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0;
  pQVar33 = this->project;
  ProKey::ProKey((ProKey *)local_88,"INSTALLS");
  pPVar17 = QMakeEvaluator::valuesRef(&pQVar33->super_QMakeEvaluator,(ProKey *)local_88);
  if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  if ((pPVar17->super_QList<ProString>).d.size != 0) {
    pQVar33 = (QMakeProject *)(pPVar17->super_QList<ProString>).d.ptr;
    pMVar28 = this;
    do {
      local_108 = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
      pQStack_100 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_128._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_128._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_128._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = ".path";
      local_88._0_8_ = pQVar33;
      ProString::ProString<ProString_const&,char_const(&)[6]>
                ((ProString *)local_128,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[6]> *)local_88);
      pQVar25 = this->project;
      local_398._8_8_ = ".CONFIG";
      local_398._0_8_ = pQVar33;
      ProString::ProString<ProString_const&,char_const(&)[8]>
                ((ProString *)local_88,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)local_398);
      vector = &QMakeEvaluator::valuesRef(&pQVar25->super_QMakeEvaluator,(ProKey *)local_88)->
                super_QList<ProString>;
      this = pMVar28;
      if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          this = pMVar28;
        }
      }
      qVar18 = QtPrivate::indexOf<ProString,char[8]>(vector,(char (*) [8])"no_path",0);
      pMVar28 = this;
      if (((qVar18 == -1) &&
          (qVar18 = QtPrivate::indexOf<ProString,char[14]>(vector,(char (*) [14])"dummy_install",0),
          qVar18 == -1)) &&
         (pPVar19 = QMakeEvaluator::valuesRef
                              (&this->project->super_QMakeEvaluator,(ProKey *)local_128),
         (pPVar19->super_QList<ProString>).d.size == 0)) {
        ProString::toLatin1((QByteArray *)local_88,(ProString *)local_128);
        pQVar25 = (QMakeProject *)local_88._8_8_;
        if ((QMakeProject *)local_88._8_8_ == (QMakeProject *)0x0) {
          pQVar25 = (QMakeProject *)&QByteArray::_empty;
        }
        warn_msg(WarnLogic,"%s is not defined: install target not created\n",pQVar25);
        if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
            lVar31 = 1;
            pQVar25 = (QMakeProject *)local_88._0_8_;
LAB_0016c191:
            QArrayData::deallocate((QArrayData *)pQVar25,lVar31,0x10);
          }
        }
      }
      else {
        local_148.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_148.d.d._0_4_ = 0xaaaaaaaa;
        local_148.d.d._4_4_ = 0xaaaaaaaa;
        local_148.d.ptr._0_4_ = 0xaaaaaaaa;
        local_148.d.ptr._4_4_ = 0xaaaaaaaa;
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x13])(&local_148,this);
        local_168.d.d = (Data *)0x0;
        local_168.d.ptr = (char16_t *)0x0;
        local_168.d.size = 0;
        qVar18 = QtPrivate::indexOf<ProString,char[8]>(vector,(char (*) [8])"no_path",0);
        if ((qVar18 == -1) &&
           (qVar18 = QtPrivate::indexOf<ProString,char[14]>(vector,(char (*) [14])"dummy_install",0)
           , qVar18 == -1)) {
          QMakeEvaluator::first
                    ((ProString *)local_88,&this->project->super_QMakeEvaluator,(ProKey *)local_128)
          ;
          ProString::toQString(&local_3c8.a,(ProString *)local_88);
          fileFixify((QString *)local_398,this,&local_3c8.a,(FileFixifyTypes)0x4,false);
          pcVar5 = local_168.d.ptr;
          pDVar4 = local_168.d.d;
          uVar7 = local_398._16_8_;
          uVar6 = local_398._0_8_;
          local_398._0_8_ = local_168.d.d;
          local_168.d.d = (Data *)uVar6;
          local_168.d.ptr = (char16_t *)local_398._8_8_;
          local_398._8_8_ = pcVar5;
          local_398._16_8_ = local_168.d.size;
          local_168.d.size = uVar7;
          if ((QMakeProject *)pDVar4 != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)
                          ->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)->
                         d == 0) {
              QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
            }
          }
          if ((Data *)local_3c8.a.d.d != (Data *)0x0) {
            LOCK();
            ((local_3c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_3c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_3c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate(&(local_3c8.a.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          cVar11 = QString::endsWith((QString *)&local_168,0x2e2bf0);
          if (cVar11 == '\0') {
            QString::append((QString *)&local_168);
          }
        }
        local_188.d = (Data *)0x0;
        local_188.ptr = (QString *)0x0;
        local_188.size = 0;
        local_1a8.d = (Data *)0x0;
        local_1a8.ptr = (QString *)0x0;
        local_1a8.size = 0;
        local_1c8.d = (Data *)0x0;
        local_1c8.ptr = (QString *)0x0;
        local_1c8.size = 0;
        local_1e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_1e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_1e8.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar25 = this->project;
        local_398._8_8_ = ".extra";
        local_398._0_8_ = pQVar33;
        ProString::ProString<ProString_const&,char_const(&)[7]>
                  ((ProString *)local_88,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)local_398);
        pPVar19 = QMakeEvaluator::valuesRef(&pQVar25->super_QMakeEvaluator,(ProKey *)local_88);
        local_1e8.d = (pPVar19->super_QList<ProString>).d.d;
        local_1e8.ptr = (pPVar19->super_QList<ProString>).d.ptr;
        local_1e8.size = (pPVar19->super_QList<ProString>).d.size;
        if ((ProString *)local_1e8.d != (ProString *)0x0) {
          LOCK();
          (((Type *)&(((ProString *)local_1e8.d)->m_string).d.d)->super___atomic_base<int>)._M_i =
               (((Type *)&(((ProString *)local_1e8.d)->m_string).d.d)->super___atomic_base<int>).
               _M_i + 1;
          UNLOCK();
        }
        if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if ((SourceFiles *)local_1e8.size == (SourceFiles *)0x0) {
          pQVar25 = pMVar28->project;
          local_398._8_8_ = ".commands";
          local_398._0_8_ = pQVar33;
          ProString::ProString<ProString_const&,char_const(&)[10]>
                    ((ProString *)local_88,
                     (QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)local_398);
          other = (QArrayDataPointer<ProString> *)
                  QMakeEvaluator::valuesRef(&pQVar25->super_QMakeEvaluator,(ProKey *)local_88);
          QArrayDataPointer<ProString>::operator=(&local_1e8,other);
          if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
        }
        qVar18 = local_1e8.size;
        pMVar29 = pMVar28;
        if ((SourceFiles *)local_1e8.size != (SourceFiles *)0x0) {
          ProStringList::join((QString *)local_88,(ProStringList *)&local_1e8,(QChar)0x20);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,(QString *)local_88);
          QList<QString>::end((QList<QString> *)&local_1a8);
          if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
        }
        pQVar25 = pMVar28->project;
        local_218.d.ptr = L".files";
        local_218.d.d = (Data *)pQVar33;
        ProString::ProString<ProString_const&,char_const(&)[7]>
                  ((ProString *)local_88,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)&local_218);
        pPVar19 = QMakeEvaluator::valuesRef(&pQVar25->super_QMakeEvaluator,(ProKey *)local_88);
        local_200.d = (pPVar19->super_QList<ProString>).d.d;
        local_200.ptr = (pPVar19->super_QList<ProString>).d.ptr;
        local_200.size = (pPVar19->super_QList<ProString>).d.size;
        if (local_200.d != (Data *)0x0) {
          LOCK();
          ((local_200.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_200.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QVar40.m_data = (storage_type *)0x0;
        QVar40.m_size = (qsizetype)local_398;
        QString::fromUtf8(QVar40);
        local_418.super_ProString.m_string.d.d = (Data *)local_398._0_8_;
        local_418.super_ProString.m_string.d.ptr = (char16_t *)local_398._8_8_;
        local_418.super_ProString.m_string.d.size = local_398._16_8_;
        l.super_QList<ProString>.d.ptr = (ProString *)pQVar33;
        l.super_QList<ProString>.d.d = (Data *)pMVar29;
        l.super_QList<ProString>.d.size = (qsizetype)in_stack_fffffffffffffa58;
        this = pMVar29;
        findFilesInVPATH((ProStringList *)&local_3c8,pMVar29,l,'\0',(QString *)0x4);
        local_398._16_8_ = local_1e8.size;
        local_398._8_8_ = local_1e8.ptr;
        local_398._0_8_ = local_1e8.d;
        local_1e8.size = local_3c8.a.d.size;
        local_1e8.ptr = (ProString *)local_3c8.a.d.ptr;
        local_1e8.d = (Data *)local_3c8.a.d.d;
        local_3c8.a.d.d = (Data *)0x0;
        local_3c8.a.d.ptr = (char16_t *)0x0;
        local_3c8.a.d.size = 0;
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_398);
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_3c8)
        ;
        pQVar25 = in_stack_fffffffffffffa58;
        if ((QMakeProject *)local_418.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)
                   &((QMakeEvaluator *)&(local_418.super_ProString.m_string.d.d)->super_QArrayData)
                    ->m_caller)->d =
               *(int *)&((DataPointer *)
                        &((QMakeEvaluator *)
                         &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d
               + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)
                       &((QMakeEvaluator *)
                        &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d
              == 0) {
            QArrayData::deallocate
                      (&(local_418.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        QArrayDataPointer<ProString>::~QArrayDataPointer(&local_200);
        if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        ProStringList::toQStringList((QStringList *)&local_3c8,(ProStringList *)&local_1e8);
        fileFixify((QStringList *)local_398,pMVar29,(QStringList *)&local_3c8,(FileFixifyTypes)0x4,
                   true);
        local_78.d = (Data *)local_188.size;
        local_88._8_8_ = local_188.ptr;
        local_88._0_8_ = local_188.d;
        local_188.size = local_398._16_8_;
        local_188.ptr = (QString *)local_398._8_8_;
        local_188.d = (Data *)local_398._0_8_;
        local_398._0_8_ = (QMakeProject *)0x0;
        local_398._8_8_ = (QMakeProject *)0x0;
        local_398._16_8_ = (QMakeProject *)0x0;
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_88);
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_398);
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_3c8);
        if ((SourceFiles *)local_188.size == (SourceFiles *)0x0) {
          local_398._0_8_ = (QMakeProject *)0x0;
          local_398._8_8_ = (QMakeProject *)0x0;
          local_398._16_8_ = (QMakeProject *)0x0;
          if ((SourceFiles *)qVar18 != (SourceFiles *)0x0) goto LAB_0016b66b;
          ProString::toQString(&local_3c8.a,(ProString *)pQVar33);
          (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x12])
                    ((ProString *)local_88,pMVar29,&local_3c8);
          QVar10.d = local_78.d;
          uVar8 = local_88._0_8_;
          uVar7 = local_398._8_8_;
          uVar6 = local_398._0_8_;
          local_88._0_8_ = local_398._0_8_;
          local_398._0_8_ = uVar8;
          local_398._8_8_ = local_88._8_8_;
          local_88._8_8_ = uVar7;
          local_78.d = (Data *)local_398._16_8_;
          local_398._16_8_ = QVar10.d;
          if ((QMakeProject *)uVar6 != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
            }
          }
          if ((QMakeProject *)local_3c8.a.d.d != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)
                     &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)->d =
                 *(int *)&((DataPointer *)
                          &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)->d +
                 -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)
                         &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)->d ==
                0) {
              QArrayData::deallocate(&(local_3c8.a.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        else {
          local_218.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_218.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_218.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar34 = pMVar29->project;
          local_3c8.a.d.ptr = L".base";
          local_3c8.a.d.d = (Data *)pQVar33;
          ProString::ProString<ProString_const&,char_const(&)[6]>
                    ((ProString *)local_398,
                     (QStringBuilder<const_ProString_&,_const_char_(&)[6]> *)&local_3c8);
          QMakeEvaluator::first
                    ((ProString *)local_88,&pQVar34->super_QMakeEvaluator,(ProKey *)local_398);
          ProString::toQString(&local_218,(ProString *)local_88);
          pMVar29 = this;
          in_stack_fffffffffffffa58 = pQVar25;
          if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              pMVar29 = this;
              in_stack_fffffffffffffa58 = pQVar25;
            }
          }
          if ((QMakeProject *)local_398._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
            }
          }
          this = pMVar29;
          if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
               )local_218.d.size !=
              (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
               )0x0) {
            local_88._0_8_ = local_218.d.d;
            local_88._8_8_ = local_218.d.ptr;
            local_78.d = (Data *)local_218.d.size;
            if ((QMakeProject *)local_218.d.d != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)
                       &((QMakeEvaluator *)&(local_218.d.d)->super_QArrayData)->m_caller)->d =
                   *(int *)&((DataPointer *)
                            &((QMakeEvaluator *)&(local_218.d.d)->super_QArrayData)->m_caller)->d +
                   1;
              UNLOCK();
            }
            string.d.ptr = (char16_t *)pQVar33;
            string.d.d = (Data *)pMVar29;
            string.d.size = (qsizetype)in_stack_fffffffffffffa58;
            Option::fixString((QString *)local_398,string,(uchar)(ProString *)local_88);
            if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              }
            }
            pcVar5 = local_218.d.ptr;
            pDVar4 = local_218.d.d;
            uVar7 = local_398._16_8_;
            uVar6 = local_398._0_8_;
            local_398._0_8_ = local_218.d.d;
            local_218.d.d = (Data *)uVar6;
            local_218.d.ptr = (char16_t *)local_398._8_8_;
            local_398._8_8_ = pcVar5;
            local_398._16_8_ = local_218.d.size;
            local_218.d.size = uVar7;
            if ((QMakeProject *)pDVar4 != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)->d
                   = *(int *)&((DataPointer *)
                              &((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)
                           ->d == 0) {
                QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
              }
            }
            cVar11 = QString::endsWith((QString *)&local_218,0x2e2bf0);
            if (cVar11 == '\0') {
              QString::append((QString *)&local_218);
            }
          }
          iVar20 = QList<QString>::begin((QList<QString> *)&local_188);
          iVar21 = QList<QString>::end((QList<QString> *)&local_188);
          pQVar25 = in_stack_fffffffffffffa58;
          if (iVar20.i != iVar21.i) {
            do {
              local_238.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_238.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_238.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              local_88._0_8_ = ((iVar20.i)->d).d;
              local_88._8_8_ = ((iVar20.i)->d).ptr;
              local_78.d = (Data *)((iVar20.i)->d).size;
              if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)
                         &(((QMakeProject *)local_88._0_8_)->super_QMakeEvaluator).m_caller)->d =
                     *(int *)&((DataPointer *)
                              &(((QMakeProject *)local_88._0_8_)->super_QMakeEvaluator).m_caller)->d
                     + 1;
                UNLOCK();
              }
              string_00.d.ptr = (char16_t *)pQVar33;
              string_00.d.d = (Data *)this;
              string_00.d.size = (qsizetype)pQVar25;
              Option::fixString(&local_238,string_00,
                                (uchar)(QStringBuilder<const_char_(&)[13],_QString> *)local_88);
              if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1
                ;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0)
                {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              local_248 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
              local_258._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_258._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              qmake_getpwd();
              local_278._0_8_ = local_238.d.d;
              local_278._8_8_ = local_238.d.ptr;
              local_268.d.ptr =
                   (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                    )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                      )local_238.d.size;
              if ((QMakeProject *)local_238.d.d != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)
                         &((QMakeEvaluator *)&(local_238.d.d)->super_QArrayData)->m_caller)->d =
                     *(int *)&((DataPointer *)
                              &((QMakeEvaluator *)&(local_238.d.d)->super_QArrayData)->m_caller)->d
                     + 1;
                UNLOCK();
              }
              iVar16 = QString::lastIndexOf
                                 ((QString *)local_278,0x2e2bf0,(CaseSensitivity)local_238.d.size);
              if (iVar16 != -1) {
                if ((QMakeProject *)(long)(iVar16 + 1) < (ulong)local_268.d.ptr) {
                  QString::QString((QString *)local_88,(QChar *)local_278._8_8_,
                                   (longlong)(long)(iVar16 + 1));
                }
                else {
                  local_88._0_8_ = local_278._0_8_;
                  local_88._8_8_ = local_278._8_8_;
                  local_78.d = (Data *)local_268.d.ptr;
                  if ((QMakeProject *)local_278._0_8_ != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_278._0_8_)->m_caller)->d =
                         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_278._0_8_)->m_caller)->d
                         + 1;
                    UNLOCK();
                  }
                }
                QVar10.d = local_78.d;
                uVar8 = local_88._0_8_;
                uVar7 = local_258._8_8_;
                uVar6 = local_258._0_8_;
                local_88._0_8_ = local_258._0_8_;
                local_258._0_8_ = uVar8;
                local_258._8_8_ = local_88._8_8_;
                local_88._8_8_ = uVar7;
                local_78.d = (Data *)local_248;
                local_248 = (QMakeProject *)QVar10.d;
                if ((QMakeProject *)uVar6 != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d + -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d == 0) {
                    QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
                  }
                }
                QString::remove((longlong)local_278,0);
              }
              cVar11 = QString::endsWith((QString *)local_258,0x2e2bf0);
              if (cVar11 == '\0') {
                QString::append((QString *)local_258);
              }
              local_298._0_8_ = local_168.d.d;
              local_298._8_8_ = local_168.d.ptr;
              local_288.ptr = (QMakeFeatureRoots *)local_168.d.size;
              if ((QMakeProject *)local_168.d.d != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)
                         &((QMakeEvaluator *)&(local_168.d.d)->super_QArrayData)->m_caller)->d =
                     *(int *)&((DataPointer *)
                              &((QMakeEvaluator *)&(local_168.d.d)->super_QArrayData)->m_caller)->d
                     + 1;
                UNLOCK();
              }
              pQVar25 = in_stack_fffffffffffffa58;
              if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                   )local_218.d.size !=
                  (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                   )0x0) {
                cVar11 = QString::startsWith((QString *)local_258,(CaseSensitivity)&local_218);
                if (cVar11 == '\0') {
                  QString::toLocal8Bit_helper((QChar *)local_88,(longlong)local_238.d.ptr);
                  pDVar36 = (Data *)local_88._8_8_;
                  if ((Data *)local_88._8_8_ == (Data *)0x0) {
                    pDVar36 = (Data *)&QByteArray::_empty;
                  }
                  ProString::toQString(&local_3c8.a,(ProString *)pQVar33);
                  QString::toLocal8Bit_helper((QChar *)local_398,(longlong)local_3c8.a.d.ptr);
                  pQVar34 = (QMakeProject *)local_398._8_8_;
                  if ((QMakeProject *)local_398._8_8_ == (QMakeProject *)0x0) {
                    pQVar34 = (QMakeProject *)&QByteArray::_empty;
                  }
                  QString::toLocal8Bit_helper((QChar *)&local_418,(longlong)local_218.d.ptr);
                  pQVar32 = (QMakeProject *)local_418.super_ProString.m_string.d.ptr;
                  if ((QMakeProject *)local_418.super_ProString.m_string.d.ptr ==
                      (QMakeProject *)0x0) {
                    pQVar32 = (QMakeProject *)&QByteArray::_empty;
                  }
                  warn_msg(WarnLogic,"File %s in install rule %s does not start with base %s",
                           pDVar36,pQVar34,pQVar32);
                  pMVar29 = this;
                  in_stack_fffffffffffffa58 = pQVar25;
                  if ((QMakeProject *)local_418.super_ProString.m_string.d.d != (QMakeProject *)0x0)
                  {
                    LOCK();
                    *(int *)&((DataPointer *)
                             &((QMakeEvaluator *)
                              &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller
                             )->d =
                         *(int *)&((DataPointer *)
                                  &((QMakeEvaluator *)
                                   &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                   m_caller)->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)
                                  &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                  m_caller)->d == 0) {
                      QArrayData::deallocate
                                (&(local_418.super_ProString.m_string.d.d)->super_QArrayData,1,0x10)
                      ;
                      pMVar29 = this;
                      in_stack_fffffffffffffa58 = pQVar25;
                    }
                  }
                  if ((QMakeProject *)local_398._0_8_ != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d =
                         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d
                         + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d
                        == 0) {
                      QArrayData::deallocate((QArrayData *)local_398._0_8_,1,0x10);
                    }
                  }
                  this = pMVar29;
                  pQVar25 = in_stack_fffffffffffffa58;
                  if ((QMakeProject *)local_3c8.a.d.d != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)
                             &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)->d
                         = *(int *)&((DataPointer *)
                                    &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->
                                     m_caller)->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller
                                 )->d == 0) {
                      QArrayData::deallocate(&(local_3c8.a.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d
                         + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d
                        == 0) {
                      lVar31 = 1;
                      pQVar34 = (QMakeProject *)local_88._0_8_;
                      goto LAB_001699f4;
                    }
                  }
                }
                else {
                  local_398._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_398._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_398._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  QString::mid((longlong)local_398,(longlong)local_258);
                  QString::append((QString *)local_298);
                  if (((QMakeProject *)local_398._16_8_ != (QMakeProject *)0x0) &&
                     ((local_f0.d == (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0 ||
                      (pNVar22 = QHashPrivate::Data<QHashPrivate::Node<QString,_QHashDummyValue>_>::
                                 findNode<QString>(local_f0.d,(QString *)local_398),
                      pNVar22 == (Node<QString,_QHashDummyValue> *)0x0)))) {
                    in_stack_fffffffffffffa58 = pQVar25;
                    QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
                              ((QHash<QString,QHashDummyValue> *)&local_f0,(QString *)local_398,
                               (QHashDummyValue *)local_88);
                    local_3c8.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    local_3c8.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_3c8.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    fileFixify(&local_3c8.a,pMVar29,(QString *)local_298,(FileFixifyTypes)0x4,false)
                    ;
                    pMVar28 = (MakefileGenerator *)0x1;
                    QString::chop((longlong)&local_3c8);
                    filePrefixRoot((QString *)&local_418,pMVar28,&local_148,&local_3c8.a);
                    mkdir_p_asstring((QString *)local_88,pMVar29,(QString *)&local_418,true);
                    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                              ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,
                               (QString *)local_88);
                    QList<QString>::end((QList<QString> *)&local_1a8);
                    if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->
                                    d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d
                          == 0) {
                        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_418.super_ProString.m_string.d.d !=
                        (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)
                                &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                m_caller)->d =
                           *(int *)&((DataPointer *)
                                    &((QMakeEvaluator *)
                                     &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                     m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)
                                    &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                    m_caller)->d == 0) {
                        QArrayData::deallocate
                                  (&(local_418.super_ProString.m_string.d.d)->super_QArrayData,2,
                                   0x10);
                      }
                    }
                    pQVar34 = (QMakeProject *)(long)(int)local_168.d.size;
                    pQVar25 = in_stack_fffffffffffffa58;
                    if ((long)pQVar34 < (long)local_288.ptr) {
                      do {
                        if ((Option::dir_sep.d.size == 1) &&
                           (*Option::dir_sep.d.ptr ==
                            *(char16_t *)
                             ((long)&((DataPointer *)&((QMakeEvaluator *)local_298._8_8_)->m_caller)
                                     ->d + (long)pQVar34 * 2))) {
                          local_418.super_ProString.m_string.d.size =
                               (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                          local_418.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                          local_418.super_ProString.m_string.d.ptr =
                               (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                          if (pQVar34 < local_288.ptr) {
                            QString::QString((QString *)&local_418,(QChar *)local_298._8_8_,
                                             (longlong)pQVar34);
                          }
                          else {
                            local_418.super_ProString.m_string.d.d = (Data *)local_298._0_8_;
                            local_418.super_ProString.m_string.d.ptr = (char16_t *)local_298._8_8_;
                            local_418.super_ProString.m_string.d.size = (qsizetype)local_288.ptr;
                            if ((QMakeProject *)local_298._0_8_ != (QMakeProject *)0x0) {
                              LOCK();
                              *(int *)&((DataPointer *)
                                       &((QMakeEvaluator *)local_298._0_8_)->m_caller)->d =
                                   *(int *)&((DataPointer *)
                                            &((QMakeEvaluator *)local_298._0_8_)->m_caller)->d + 1;
                              UNLOCK();
                            }
                          }
                          if ((local_f8.d ==
                               (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0) ||
                             (pNVar22 = QHashPrivate::
                                        Data<QHashPrivate::Node<QString,_QHashDummyValue>_>::
                                        findNode<QString>(local_f8.d,(QString *)&local_418),
                             pNVar22 == (Node<QString,_QHashDummyValue> *)0x0)) {
                            in_stack_fffffffffffffa58 = pQVar25;
                            QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
                                      ((QHash<QString,QHashDummyValue> *)&local_f8,
                                       (QString *)&local_418,(QHashDummyValue *)local_88);
                            pMVar28 = pMVar29;
                            fileFixify((QString *)local_88,pMVar29,(QString *)&local_418,
                                       (FileFixifyTypes)0x4,false);
                            QVar10.d = local_78.d;
                            uVar6 = local_88._0_8_;
                            pcVar5 = local_3c8.a.d.ptr;
                            pDVar4 = local_3c8.a.d.d;
                            local_88._0_8_ = local_3c8.a.d.d;
                            local_3c8.a.d.d = (Data *)uVar6;
                            local_3c8.a.d.ptr = (char16_t *)local_88._8_8_;
                            local_88._8_8_ = pcVar5;
                            local_78.d = (Data *)local_3c8.a.d.size;
                            local_3c8.a.d.size = (qsizetype)QVar10.d;
                            if ((QMakeProject *)pDVar4 != (QMakeProject *)0x0) {
                              LOCK();
                              *(int *)&((DataPointer *)
                                       &((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)->d
                                   = *(int *)&((DataPointer *)
                                              &((QMakeEvaluator *)&pDVar4->super_QArrayData)->
                                               m_caller)->d + -1;
                              UNLOCK();
                              if (*(int *)&((DataPointer *)
                                           &((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)
                                           ->d == 0) {
                                pMVar28 = (MakefileGenerator *)0x2;
                                QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
                              }
                            }
                            filePrefixRoot((QString *)local_2f8,pMVar28,&local_148,&local_3c8.a);
                            (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                                      (local_2f8 + 0x20,pMVar29,(QString *)local_2f8);
                            pQStack_70 = local_2c8;
                            local_78.d = (Data *)QStack_2d0.d;
                            local_88._8_8_ = local_2f8._32_8_;
                            local_88._0_8_ = "-$(DEL_DIR) ";
                            local_2f8._32_8_ = (Data *)0x0;
                            QStack_2d0.d = (Data *)0x0;
                            local_2c8 = (QMakeProject *)0x0;
                            QStringBuilder<const_char_(&)[13],_QString>::convertTo<QString>
                                      (&local_2b8,
                                       (QStringBuilder<const_char_(&)[13],_QString> *)local_88);
                            QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                                      ((QMovableArrayOps<QString> *)&local_1c8,local_1c8.size,
                                       &local_2b8);
                            QList<QString>::end((QList<QString> *)&local_1c8);
                            if (&(local_2b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                              LOCK();
                              ((local_2b8.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i =
                                   ((local_2b8.d.d)->super_QArrayData).ref_._q_value.
                                   super___atomic_base<int>._M_i + -1;
                              UNLOCK();
                              if (((local_2b8.d.d)->super_QArrayData).ref_._q_value.
                                  super___atomic_base<int>._M_i == 0) {
                                QArrayData::deallocate(&(local_2b8.d.d)->super_QArrayData,2,0x10);
                              }
                            }
                            pQVar25 = in_stack_fffffffffffffa58;
                            if ((Data *)local_88._8_8_ != (Data *)0x0) {
                              LOCK();
                              (((QBasicAtomicInt *)local_88._8_8_)->_q_value).
                              super___atomic_base<int>._M_i =
                                   (((QBasicAtomicInt *)local_88._8_8_)->_q_value).
                                   super___atomic_base<int>._M_i + -1;
                              UNLOCK();
                              if ((((QBasicAtomicInt *)local_88._8_8_)->_q_value).
                                  super___atomic_base<int>._M_i == 0) {
                                QArrayData::deallocate((QArrayData *)local_88._8_8_,2,0x10);
                              }
                            }
                            if ((Data *)local_2f8._32_8_ != (Data *)0x0) {
                              LOCK();
                              (((QBasicAtomicInt *)local_2f8._32_8_)->_q_value).
                              super___atomic_base<int>._M_i =
                                   (((QBasicAtomicInt *)local_2f8._32_8_)->_q_value).
                                   super___atomic_base<int>._M_i + -1;
                              UNLOCK();
                              if ((((QBasicAtomicInt *)local_2f8._32_8_)->_q_value).
                                  super___atomic_base<int>._M_i == 0) {
                                QArrayData::deallocate((QArrayData *)local_2f8._32_8_,2,0x10);
                              }
                            }
                            if ((QMakeProject *)local_2f8._0_8_ != (QMakeProject *)0x0) {
                              LOCK();
                              *(int *)&((DataPointer *)
                                       &((QMakeEvaluator *)local_2f8._0_8_)->m_caller)->d =
                                   *(int *)&((DataPointer *)
                                            &((QMakeEvaluator *)local_2f8._0_8_)->m_caller)->d + -1;
                              UNLOCK();
                              if (*(int *)&((DataPointer *)
                                           &((QMakeEvaluator *)local_2f8._0_8_)->m_caller)->d == 0)
                              {
                                QArrayData::deallocate((QArrayData *)local_2f8._0_8_,2,0x10);
                              }
                            }
                          }
                          if ((QMakeProject *)local_418.super_ProString.m_string.d.d !=
                              (QMakeProject *)0x0) {
                            LOCK();
                            *(int *)&((DataPointer *)
                                     &((QMakeEvaluator *)
                                      &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                      m_caller)->d =
                                 *(int *)&((DataPointer *)
                                          &((QMakeEvaluator *)
                                           &(local_418.super_ProString.m_string.d.d)->
                                            super_QArrayData)->m_caller)->d + -1;
                            UNLOCK();
                            if (*(int *)&((DataPointer *)
                                         &((QMakeEvaluator *)
                                          &(local_418.super_ProString.m_string.d.d)->
                                           super_QArrayData)->m_caller)->d == 0) {
                              QArrayData::deallocate
                                        (&(local_418.super_ProString.m_string.d.d)->super_QArrayData
                                         ,2,0x10);
                            }
                          }
                        }
                        pQVar34 = (QMakeProject *)
                                  ((long)&((DataPointer *)&(pQVar34->super_QMakeEvaluator).m_caller)
                                          ->d + 1);
                      } while ((long)pQVar34 < (long)local_288.ptr);
                    }
                    if ((QMakeProject *)local_3c8.a.d.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)
                               ->d = *(int *)&((DataPointer *)
                                              &((QMakeEvaluator *)
                                               &(local_3c8.a.d.d)->super_QArrayData)->m_caller)->d +
                                     -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->
                                    m_caller)->d == 0) {
                        QArrayData::deallocate(&(local_3c8.a.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                  }
                  if ((QMakeProject *)local_398._0_8_ != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d =
                         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d
                         + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d
                        == 0) {
                      lVar31 = 2;
                      pQVar34 = (QMakeProject *)local_398._0_8_;
LAB_001699f4:
                      QArrayData::deallocate((QArrayData *)pQVar34,lVar31,0x10);
                    }
                  }
                }
              }
              ProKey::ProKey((ProKey *)local_88,"TARGET");
              (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                        (&local_3c8,pMVar29,(QStringBuilder<const_char_(&)[13],_QString> *)local_88)
              ;
              fileFixify((QString *)local_398,pMVar29,&local_3c8.a,(FileFixifyTypes)0x4,true);
              if (local_238.d.size == local_398._16_8_) {
                QVar42.m_data = local_238.d.ptr;
                QVar42.m_size = local_238.d.size;
                QVar52.m_data = (storage_type_conflict *)local_398._8_8_;
                QVar52.m_size = local_398._16_8_;
                cVar11 = QtPrivate::equalStrings(QVar42,QVar52);
                pMVar29 = this;
              }
              else {
                cVar11 = '\0';
                pMVar29 = this;
              }
              if ((QMakeProject *)local_398._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d +
                     -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d == 0
                   ) {
                  QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
                }
              }
              if ((QMakeProject *)local_3c8.a.d.d != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)
                         &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)->d =
                     *(int *)&((DataPointer *)
                              &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)->
                              d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)
                             &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)->d
                    == 0) {
                  QArrayData::deallocate(&(local_3c8.a.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1
                ;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0)
                {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              pcVar30 = "nostrip";
              bVar15 = ProStringList::contains((ProStringList *)vector,"nostrip",CaseSensitive);
              cVar13 = '\x01';
              if (cVar11 == '\0') {
                local_548 = (QMakeProject *)local_238.d.d;
                if ((QMakeProject *)local_238.d.d != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)
                           &((QMakeEvaluator *)&(local_238.d.d)->super_QArrayData)->m_caller)->d =
                       *(int *)&((DataPointer *)
                                &((QMakeEvaluator *)&(local_238.d.d)->super_QArrayData)->m_caller)->
                                d + 1;
                  UNLOCK();
                  LOCK();
                  *(int *)&((DataPointer *)
                           &((QMakeEvaluator *)&(local_238.d.d)->super_QArrayData)->m_caller)->d =
                       *(int *)&((DataPointer *)
                                &((QMakeEvaluator *)&(local_238.d.d)->super_QArrayData)->m_caller)->
                                d + 1;
                  UNLOCK();
                }
                local_78.d = (Data *)local_238.d.size;
                local_88._8_8_ = local_238.d.ptr;
                local_88._0_8_ = local_238.d.d;
                file.d.ptr = (char16_t *)pQVar33;
                file.d.d = (Data *)pMVar29;
                file.d.size = (qsizetype)pQVar25;
                fileInfo((MakefileGenerator *)local_398,file);
                cVar13 = QFileInfo::exists();
                QFileInfo::~QFileInfo((QFileInfo *)local_398);
                if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d +
                       -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d ==
                      0) {
                    pcVar30 = (char *)0x2;
                    QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                  }
                }
              }
              if (local_548 != (QMakeProject *)0x0 && cVar11 == '\0') {
                LOCK();
                *(int *)&((DataPointer *)&(local_548->super_QMakeEvaluator).m_caller)->d =
                     *(int *)&((DataPointer *)&(local_548->super_QMakeEvaluator).m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&(local_548->super_QMakeEvaluator).m_caller)->d == 0) {
                  pcVar30 = (char *)0x2;
                  QArrayData::deallocate((QArrayData *)local_548,2,0x10);
                }
              }
              this = pMVar29;
              if (cVar13 == '\0') {
                local_2b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_2b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_2b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                local_88._0_8_ = local_258._0_8_;
                local_88._8_8_ = local_258._8_8_;
                local_78.d = (Data *)local_248;
                if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_258._0_8_)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_258._0_8_)->m_caller)->d +
                       1;
                  UNLOCK();
                }
                string_01.d.ptr = (char16_t *)pQVar33;
                string_01.d.d = (Data *)pMVar29;
                string_01.d.size = (qsizetype)pQVar25;
                Option::fixString(&local_2b8,string_01,
                                  (uchar)(QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                                          *)local_88);
                if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d +
                       -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d ==
                      0) {
                    QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                  }
                }
                local_2c8 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
                local_2f8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
                QStack_2d0.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                QDir::QDir((QDir *)local_398,(QString *)&local_2b8);
                local_88._0_8_ = (QMakeProject *)0x0;
                local_88._8_8_ = (QMakeProject *)0x0;
                local_78.d = (Data *)0x0;
                QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                          ((QMovableArrayOps<QString> *)local_88,0,(QString *)local_278);
                QList<QString>::end((QList<QString> *)local_88);
                QDir::entryList(local_2f8 + 0x20,(MakefileGenerator *)local_398,
                                (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                                 *)local_88,0x6007);
                QArrayDataPointer<QString>::~QArrayDataPointer
                          ((QArrayDataPointer<QString> *)local_88);
                QDir::~QDir((QDir *)local_398);
                pcVar30 = "no_check_exist";
                bVar14 = ProStringList::contains
                                   ((ProStringList *)vector,"no_check_exist",CaseSensitive);
                if ((bVar14) && (local_2c8 == (QMakeProject *)0x0)) {
                  local_398._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_398._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_398._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  filePrefixRoot((QString *)local_398,(MakefileGenerator *)pcVar30,&local_148,
                                 (QString *)local_298);
                  cVar11 = QString::endsWith((QString *)local_398,0x2e2bf0);
                  in_stack_fffffffffffffa58 = pQVar25;
                  if (cVar11 == '\0') {
                    QString::append((QString *)local_398);
                    in_stack_fffffffffffffa58 = pQVar25;
                  }
                  QString::append((QString *)local_398);
                  local_3c8.a.d.d = (Data *)0x0;
                  local_3c8.a.d.ptr = (char16_t *)0x0;
                  local_3c8.a.d.size = 0;
                  bVar14 = ProStringList::contains
                                     ((ProStringList *)vector,"executable",CaseSensitive);
                  if (bVar14) {
                    qVar18 = 0x13;
                    pcVar30 = "$(QINSTALL_PROGRAM)";
                  }
                  else {
                    qVar18 = 0xb;
                    pcVar30 = "$(QINSTALL)";
                  }
                  QVar53.m_data = pcVar30;
                  QVar53.m_size = qVar18;
                  QString::operator=(&local_3c8.a,QVar53);
                  (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                            (&local_418,pMVar29,&local_238);
                  qVar18 = local_418.super_ProString.m_string.d.size;
                  pcVar5 = local_418.super_ProString.m_string.d.ptr;
                  pDVar4 = local_418.super_ProString.m_string.d.d;
                  local_418.super_ProString.m_string.d.size = 0;
                  local_418.super_ProString.m_string.d.d = (Data *)0x0;
                  local_418.super_ProString.m_string.d.ptr = (char16_t *)0x0;
                  (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                            (local_2f8,pMVar29,local_398);
                  local_50 = (QMakeProject *)local_2f8._16_8_;
                  PStack_58.d.d.ptr =
                       (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                        )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                          )local_2f8._8_8_;
                  local_60 = (QMakeProject *)local_2f8._0_8_;
                  local_88._0_8_ = " ";
                  local_88._8_8_ = pDVar4;
                  local_78.d = (Data *)pcVar5;
                  pQStack_70 = (QMakeProject *)qVar18;
                  pQStack_68 = (QMakeProject *)0x2adf3e;
                  local_2f8._0_8_ = (QMakeProject *)0x0;
                  local_2f8._8_8_ = (QMakeProject *)0x0;
                  local_2f8._16_8_ = (QMakeProject *)0x0;
                  ::operator+=(&local_3c8.a,
                               (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                                *)local_88);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                                     *)local_88);
                  if ((QMakeProject *)local_2f8._0_8_ != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2f8._0_8_)->m_caller)->d =
                         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2f8._0_8_)->m_caller)->d
                         + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2f8._0_8_)->m_caller)->d
                        == 0) {
                      QArrayData::deallocate((QArrayData *)local_2f8._0_8_,2,0x10);
                    }
                  }
                  if ((QMakeProject *)local_418.super_ProString.m_string.d.d != (QMakeProject *)0x0)
                  {
                    LOCK();
                    *(int *)&((DataPointer *)
                             &((QMakeEvaluator *)
                              &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller
                             )->d =
                         *(int *)&((DataPointer *)
                                  &((QMakeEvaluator *)
                                   &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                   m_caller)->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)
                                  &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                  m_caller)->d == 0) {
                      QArrayData::deallocate
                                (&(local_418.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
                      ;
                    }
                  }
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,&local_3c8.a);
                  QList<QString>::end((QList<QString> *)&local_1a8);
                  local_450.d.d = (Data *)local_298;
                  local_450.d.ptr = (char16_t *)local_278;
                  QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                            (&local_438,(QStringBuilder<QString_&,_QString_&> *)&local_450);
                  pMVar28 = pMVar29;
                  fileFixify(&local_3e8,pMVar29,&local_438,(FileFixifyTypes)0x4,false);
                  filePrefixRoot(&local_358,pMVar28,&local_148,&local_3e8);
                  (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                            (local_2f8,pMVar29,&local_358);
                  pQStack_68 = (QMakeProject *)local_2f8._16_8_;
                  pQStack_70 = (QMakeProject *)local_2f8._8_8_;
                  local_78.d = (Data *)local_2f8._0_8_;
                  local_88._0_8_ = local_a8;
                  local_88._8_8_ = " ";
                  local_2f8._0_8_ = (QMakeProject *)0x0;
                  local_2f8._8_8_ =
                       (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                        *)0x0;
                  local_2f8._16_8_ = (QMakeProject *)0x0;
                  QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>::
                  convertTo<QString>((QString *)&local_418,
                                     (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>
                                      *)local_88);
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                            ((QMovableArrayOps<QString> *)&local_1c8,local_1c8.size,
                             (QString *)&local_418);
                  QList<QString>::end((QList<QString> *)&local_1c8);
                  if ((QMakeProject *)local_418.super_ProString.m_string.d.d != (QMakeProject *)0x0)
                  {
                    LOCK();
                    *(int *)&((DataPointer *)
                             &((QMakeEvaluator *)
                              &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller
                             )->d =
                         *(int *)&((DataPointer *)
                                  &((QMakeEvaluator *)
                                   &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                   m_caller)->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)
                                  &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                  m_caller)->d == 0) {
                      QArrayData::deallocate
                                (&(local_418.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
                      ;
                    }
                  }
                  pQVar25 = in_stack_fffffffffffffa58;
                  if ((QMakeProject *)local_78.d != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_78.d)->ref)->m_caller)->d =
                         *(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_78.d)->ref)->m_caller)
                                  ->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_78.d)->ref)->m_caller)
                                 ->d == 0) {
                      QArrayData::deallocate((QArrayData *)local_78.d,2,0x10);
                    }
                  }
                  if ((QMakeProject *)local_2f8._0_8_ != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2f8._0_8_)->m_caller)->d =
                         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2f8._0_8_)->m_caller)->d
                         + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2f8._0_8_)->m_caller)->d
                        == 0) {
                      QArrayData::deallocate((QArrayData *)local_2f8._0_8_,2,0x10);
                    }
                  }
                  if (&(local_358.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_358.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_358.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QMakeProject *)local_3e8.d.d != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)
                             &((QMakeEvaluator *)&(local_3e8.d.d)->super_QArrayData)->m_caller)->d =
                         *(int *)&((DataPointer *)
                                  &((QMakeEvaluator *)&(local_3e8.d.d)->super_QArrayData)->m_caller)
                                  ->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)&(local_3e8.d.d)->super_QArrayData)->m_caller)
                                 ->d == 0) {
                      QArrayData::deallocate(&(local_3e8.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((ProString *)local_438.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_438.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_438.d.d)->super_QArrayData)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_438.d.d)->super_QArrayData)->d).d == 0) {
                      QArrayData::deallocate(&(local_438.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QMakeProject *)local_3c8.a.d.d != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)
                             &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)->d
                         = *(int *)&((DataPointer *)
                                    &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->
                                     m_caller)->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller
                                 )->d == 0) {
                      QArrayData::deallocate(&(local_3c8.a.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QMakeProject *)local_398._0_8_ != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d =
                         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d
                         + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d
                        == 0) {
                      QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
                    }
                  }
                }
                if (local_2c8 != (QMakeProject *)0x0) {
                  lVar35 = 0x10;
                  pQVar34 = (QMakeProject *)0x0;
                  do {
                    local_2f8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_2f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_2f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    pQVar23 = QList<QString>::data((QList<QString> *)(local_2f8 + 0x20));
                    local_2f8._0_8_ = *(long *)((long)pQVar23 + lVar35 + -0x10);
                    local_2f8._8_8_ = *(undefined8 *)((long)pQVar23 + lVar35 + -8);
                    local_2f8._16_8_ = *(undefined8 *)((long)&(pQVar23->d).d + lVar35);
                    if ((QMakeProject *)local_2f8._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &(((QMakeProject *)local_2f8._0_8_)->super_QMakeEvaluator).m_caller)
                               ->d = *(int *)&((DataPointer *)
                                              &(((QMakeProject *)local_2f8._0_8_)->
                                               super_QMakeEvaluator).m_caller)->d + 1;
                      UNLOCK();
                    }
                    local_438.d.d = (Data *)local_298;
                    local_438.d.ptr = (char16_t *)local_2f8;
                    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                              (&local_3e8,(QStringBuilder<QString_&,_QString_&> *)&local_438);
                    pMVar28 = pMVar29;
                    fileFixify(&local_358,pMVar29,&local_3e8,(FileFixifyTypes)0x4,false);
                    filePrefixRoot((QString *)&local_418,pMVar28,&local_148,&local_358);
                    (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                              (&local_3c8,pMVar29,&local_418);
                    pQStack_68 = (QMakeProject *)local_3c8.a.d.size;
                    pQStack_70 = (QMakeProject *)local_3c8.a.d.ptr;
                    local_78.d = (Data *)local_3c8.a.d.d;
                    local_88._0_8_ = local_a8;
                    local_88._8_8_ = " ";
                    local_3c8.a.d.d = (Data *)0x0;
                    local_3c8.a.d.ptr = (char16_t *)0x0;
                    local_3c8.a.d.size = 0;
                    QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>::
                    convertTo<QString>((QString *)local_398,
                                       (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>
                                        *)local_88);
                    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                              ((QMovableArrayOps<QString> *)&local_1c8,local_1c8.size,
                               (QString *)local_398);
                    QList<QString>::end((QList<QString> *)&local_1c8);
                    if ((QMakeProject *)local_398._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d =
                           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)
                                    ->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->
                                   d == 0) {
                        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_78.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_78.d)->ref)->m_caller)->d
                           = *(int *)&((DataPointer *)
                                      &((QMakeEvaluator *)&(local_78.d)->ref)->m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_78.d)->ref)->m_caller
                                   )->d == 0) {
                        QArrayData::deallocate((QArrayData *)local_78.d,2,0x10);
                      }
                    }
                    if ((Data *)local_3c8.a.d.d != (Data *)0x0) {
                      LOCK();
                      ((local_3c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_3c8.a.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_3c8.a.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(&(local_3c8.a.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_418.super_ProString.m_string.d.d !=
                        (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)
                                &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                m_caller)->d =
                           *(int *)&((DataPointer *)
                                    &((QMakeEvaluator *)
                                     &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                     m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)
                                    &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                    m_caller)->d == 0) {
                        QArrayData::deallocate
                                  (&(local_418.super_ProString.m_string.d.d)->super_QArrayData,2,
                                   0x10);
                      }
                    }
                    if (&(local_358.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_358.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_358.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_3e8.d.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_3e8.d.d)->super_QArrayData)->m_caller)->d
                           = *(int *)&((DataPointer *)
                                      &((QMakeEvaluator *)&(local_3e8.d.d)->super_QArrayData)->
                                       m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_3e8.d.d)->super_QArrayData)->m_caller
                                   )->d == 0) {
                        QArrayData::deallocate(&(local_3e8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    local_488._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_88._8_8_ = local_2f8;
                    local_88._0_8_ = (QMakeProject *)local_258;
                    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                              (&local_4a0,(QStringBuilder<QString_&,_QString_&> *)local_88);
                    file_01.d.ptr = (char16_t *)pQVar33;
                    file_01.d.d = (Data *)this;
                    file_01.d.size = (qsizetype)in_stack_fffffffffffffa58;
                    fileInfo((MakefileGenerator *)local_488,file_01);
                    if (&(local_4a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_4a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_4a0.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_4a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_4a0.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    local_358.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    local_358.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_358.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    pMVar28 = pMVar29;
                    fileFixify((QString *)local_88,pMVar29,(QString *)local_298,(FileFixifyTypes)0x4
                               ,false);
                    filePrefixRoot(&local_358,pMVar28,&local_148,(QString *)local_88);
                    uVar6 = local_88._0_8_;
                    if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->
                                    d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d == 0) {
                        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                      }
                    }
                    cVar11 = QString::endsWith((QString *)&local_358,0x2e2bf0);
                    if (cVar11 == '\0') {
                      QString::append((QString *)&local_358);
                    }
                    QFileInfo::fileName();
                    QString::append((QString *)&local_358);
                    uVar6 = local_88._0_8_;
                    if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->
                                    d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d == 0) {
                        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                      }
                    }
                    local_3e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    local_3e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_3e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    local_418.super_ProString.m_string.d.ptr = (char16_t *)local_2f8;
                    local_418.super_ProString.m_string.d.d = (Data *)local_258;
                    escapeFilePath<QString&,QString&>
                              ((QString *)local_398,pMVar29,
                               (QStringBuilder<QString_&,_QString_&> *)&local_418);
                    uVar8 = local_398._16_8_;
                    uVar7 = local_398._8_8_;
                    uVar6 = local_398._0_8_;
                    local_398._16_8_ = (QMakeProject *)0x0;
                    local_398._0_8_ = (QMakeProject *)0x0;
                    local_398._8_8_ = (QMakeProject *)0x0;
                    (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                              (&local_3c8,pMVar29,&local_358);
                    pQStack_48 = (QMakeProject *)local_3c8.a.d.size;
                    local_50 = (QMakeProject *)local_3c8.a.d.ptr;
                    PStack_58.d.d.ptr =
                         (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                          )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                            )local_3c8.a.d.d;
                    local_88._0_8_ = &DAT_0000000c;
                    local_88._8_8_ = anon_var_dwarf_156ef5;
                    local_78.d = (Data *)uVar6;
                    pQStack_70 = (QMakeProject *)uVar7;
                    pQStack_68 = (QMakeProject *)uVar8;
                    local_60 = (QMakeProject *)0x2adf3e;
                    local_3c8.a.d.d = (Data *)0x0;
                    local_3c8.a.d.ptr = (char16_t *)0x0;
                    local_3c8.a.d.size = 0;
                    QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
                    ::convertTo<QString>
                              (&local_3e8,
                               (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
                                *)local_88);
                    QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
                    ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
                                       *)local_88);
                    if ((QMakeProject *)local_3c8.a.d.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)
                               ->d = *(int *)&((DataPointer *)
                                              &((QMakeEvaluator *)
                                               &(local_3c8.a.d.d)->super_QArrayData)->m_caller)->d +
                                     -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->
                                    m_caller)->d == 0) {
                        QArrayData::deallocate(&(local_3c8.a.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QMakeProject *)local_398._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d =
                           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)
                                    ->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->
                                   d == 0) {
                        QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
                      }
                    }
                    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                              ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,&local_3e8);
                    QList<QString>::end((QList<QString> *)&local_1a8);
                    bVar1 = 1;
                    if (bVar15) {
LAB_0016a437:
                      bVar14 = false;
                      bVar12 = false;
                    }
                    else {
                      pQVar25 = pMVar29->project;
                      QVar43.m_data = (storage_type *)0xa;
                      QVar43.m_size = (qsizetype)local_88;
                      QString::fromUtf8(QVar43);
                      config_00.m_data = (storage_type_conflict *)local_88._8_8_;
                      config_00.m_size = (qsizetype)local_78.d;
                      in_stack_fffffffffffffa58 = (QMakeProject *)local_88._0_8_;
                      bVar14 = QMakeEvaluator::isActiveConfig
                                         (&pQVar25->super_QMakeEvaluator,config_00,false);
                      if (!bVar14) {
                        pQVar25 = pMVar29->project;
                        QVar44.m_data = (storage_type *)0x7;
                        QVar44.m_size = (qsizetype)local_88;
                        QString::fromUtf8(QVar44);
                        local_558 = (QMakeProject *)local_88._0_8_;
                        config_01.m_data = (storage_type_conflict *)local_88._8_8_;
                        config_01.m_size = (qsizetype)local_78.d;
                        bVar14 = QMakeEvaluator::isActiveConfig
                                           (&pQVar25->super_QMakeEvaluator,config_01,false);
                        pMVar29 = this;
                        if ((!bVar14) &&
                           (cVar11 = QFileInfo::isDir(), pMVar29 = this, cVar11 == '\0')) {
                          cVar11 = QFileInfo::isExecutable();
                          if (cVar11 == '\0') {
                            bVar1 = 0;
                            this = pMVar29;
                            goto LAB_0016a437;
                          }
                          pQVar25 = pMVar29->project;
                          ProKey::ProKey(&local_4d0,"QMAKE_STRIP");
                          this = pMVar29;
                          bVar12 = QMakeProject::isEmpty(pQVar25,&local_4d0);
                          bVar12 = !bVar12;
                          bVar14 = true;
                          bVar1 = 0;
                          goto LAB_0016a509;
                        }
                        bVar1 = 0;
                        this = pMVar29;
                      }
                      bVar14 = false;
                      bVar12 = false;
                    }
LAB_0016a509:
                    pQVar25 = in_stack_fffffffffffffa58;
                    if ((bVar14) &&
                       (&(local_4d0.super_ProString.m_string.d.d)->super_QArrayData !=
                        (QArrayData *)0x0)) {
                      LOCK();
                      ((local_4d0.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i =
                           ((local_4d0.super_ProString.m_string.d.d)->super_QArrayData).ref_.
                           _q_value.super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_4d0.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value
                          .super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate
                                  (&(local_4d0.super_ProString.m_string.d.d)->super_QArrayData,2,
                                   0x10);
                      }
                    }
                    if (!(bool)(bVar1 | local_558 == (QMakeProject *)0x0)) {
                      LOCK();
                      *(int *)&((DataPointer *)&(local_558->super_QMakeEvaluator).m_caller)->d =
                           *(int *)&((DataPointer *)&(local_558->super_QMakeEvaluator).m_caller)->d
                           + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&(local_558->super_QMakeEvaluator).m_caller)->d
                          == 0) {
                        QArrayData::deallocate((QArrayData *)local_558,2,0x10);
                      }
                    }
                    if (in_stack_fffffffffffffa58 != (QMakeProject *)0x0 && !bVar15) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &(in_stack_fffffffffffffa58->super_QMakeEvaluator).m_caller)->d =
                           *(int *)&((DataPointer *)
                                    &(in_stack_fffffffffffffa58->super_QMakeEvaluator).m_caller)->d
                           + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &(in_stack_fffffffffffffa58->super_QMakeEvaluator).m_caller)->d
                          == 0) {
                        QArrayData::deallocate((QArrayData *)in_stack_fffffffffffffa58,2,0x10);
                      }
                    }
                    if (bVar12) {
                      QVar45.m_data = (storage_type *)0x1;
                      QVar45.m_size = (qsizetype)local_88;
                      QString::fromUtf8(QVar45);
                      QVar10.d = local_78.d;
                      uVar7 = local_88._8_8_;
                      uVar6 = local_88._0_8_;
                      ProKey::ProKey(&local_418,"QMAKE_STRIP");
                      (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                                (&local_450,pMVar29,&local_418);
                      local_370 = (QMakeProject *)local_450.d.size;
                      pQStack_378 = (QMakeProject *)local_450.d.ptr;
                      local_380 = local_450.d.d;
                      local_450.d.d = (Data *)0x0;
                      local_450.d.ptr = (char16_t *)0x0;
                      local_450.d.size = 0;
                      local_3c8.a.d.d = (Data *)0x0;
                      local_398._0_8_ = uVar6;
                      local_398._8_8_ = uVar7;
                      local_3c8.a.d.ptr = (char16_t *)0x0;
                      local_3c8.a.d.size = 0;
                      local_398._16_8_ = QVar10.d;
                      local_3c8.b.d.d = (Data *)0x0;
                      local_3c8.b.d.ptr = (char16_t *)0x0;
                      local_3c8.b.d.size = 0;
                      QStack_368.d.ptr =
                           (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                            )(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                              *)0x2adf3e;
                      local_510.a = (QString *)local_298;
                      local_510.b = (QString *)local_2f8;
                      QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                                ((QString *)local_500,&local_510);
                      pMVar28 = pMVar29;
                      fileFixify(&local_4e8,pMVar29,(QString *)local_500,(FileFixifyTypes)0x4,false)
                      ;
                      filePrefixRoot((QString *)(local_488 + 8),pMVar28,&local_148,&local_4e8);
                      (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                                (&local_468,pMVar29,(QString *)(local_488 + 8));
                      local_60 = local_370;
                      pQStack_68 = pQStack_378;
                      pQStack_70 = (QMakeProject *)local_380;
                      local_78.d = (Data *)local_398._16_8_;
                      local_88._8_8_ = local_398._8_8_;
                      local_88._0_8_ = local_398._0_8_;
                      local_40 = (QMakeProject *)local_468.d.size;
                      pQStack_48 = (QMakeProject *)local_468.d.ptr;
                      local_50 = (QMakeProject *)local_468.d.d;
                      local_398._0_8_ = (QMakeProject *)0x0;
                      local_398._8_8_ = (QMakeProject *)0x0;
                      local_398._16_8_ = (QMakeProject *)0x0;
                      local_380 = (Data *)0x0;
                      pQStack_378 = (QMakeProject *)0x0;
                      local_370 = (QMakeProject *)0x0;
                      PStack_58.d.d.ptr =
                           (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                            )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                              )QStack_368.d.ptr;
                      local_468.d.d = (Data *)0x0;
                      local_468.d.ptr = (char16_t *)0x0;
                      local_468.d.size = 0;
                      QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                      ::convertTo<QString>
                                (&local_438,
                                 (QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                                  *)local_88);
                      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                                ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,&local_438);
                      QList<QString>::end((QList<QString> *)&local_1a8);
                      in_stack_fffffffffffffa58 = pQVar25;
                      if ((ProString *)local_438.d.d != (ProString *)0x0) {
                        LOCK();
                        *(int *)&(((QString *)&(local_438.d.d)->super_QArrayData)->d).d =
                             *(int *)&(((QString *)&(local_438.d.d)->super_QArrayData)->d).d + -1;
                        UNLOCK();
                        if (*(int *)&(((QString *)&(local_438.d.d)->super_QArrayData)->d).d == 0) {
                          QArrayData::deallocate(&(local_438.d.d)->super_QArrayData,2,0x10);
                          in_stack_fffffffffffffa58 = pQVar25;
                        }
                      }
                      QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                      ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                                         *)local_88);
                      if ((QMakeProject *)local_468.d.d != (QMakeProject *)0x0) {
                        LOCK();
                        *(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)&(local_468.d.d)->super_QArrayData)->m_caller)
                                 ->d = *(int *)&((DataPointer *)
                                                &((QMakeEvaluator *)
                                                 &(local_468.d.d)->super_QArrayData)->m_caller)->d +
                                       -1;
                        UNLOCK();
                        if (*(int *)&((DataPointer *)
                                     &((QMakeEvaluator *)&(local_468.d.d)->super_QArrayData)->
                                      m_caller)->d == 0) {
                          QArrayData::deallocate(&(local_468.d.d)->super_QArrayData,2,0x10);
                        }
                      }
                      pQVar25 = in_stack_fffffffffffffa58;
                      if ((Data *)local_488._8_8_ != (Data *)0x0) {
                        LOCK();
                        (((QBasicAtomicInt *)local_488._8_8_)->_q_value).super___atomic_base<int>.
                        _M_i = (((QBasicAtomicInt *)local_488._8_8_)->_q_value).
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((((QBasicAtomicInt *)local_488._8_8_)->_q_value).
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate((QArrayData *)local_488._8_8_,2,0x10);
                        }
                      }
                      if (&(local_4e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_4e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_4e8.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_4e8.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_4e8.d.d)->super_QArrayData,2,0x10);
                        }
                      }
                      if ((QArrayData *)local_500._0_8_ != (QArrayData *)0x0) {
                        LOCK();
                        (((QBasicAtomicInt *)local_500._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i = (((QBasicAtomicInt *)local_500._0_8_)->_q_value).
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((((QBasicAtomicInt *)local_500._0_8_)->_q_value).
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate((QArrayData *)local_500._0_8_,2,0x10);
                        }
                      }
                      QStringBuilder<QString,_QString>::~QStringBuilder
                                ((QStringBuilder<QString,_QString> *)local_398);
                      QStringBuilder<QString,_QString>::~QStringBuilder(&local_3c8);
                      if ((QMakeProject *)local_450.d.d != (QMakeProject *)0x0) {
                        LOCK();
                        *(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)&(local_450.d.d)->super_QArrayData)->m_caller)
                                 ->d = *(int *)&((DataPointer *)
                                                &((QMakeEvaluator *)
                                                 &(local_450.d.d)->super_QArrayData)->m_caller)->d +
                                       -1;
                        UNLOCK();
                        if (*(int *)&((DataPointer *)
                                     &((QMakeEvaluator *)&(local_450.d.d)->super_QArrayData)->
                                      m_caller)->d == 0) {
                          QArrayData::deallocate(&(local_450.d.d)->super_QArrayData,2,0x10);
                        }
                      }
                      if ((QMakeProject *)local_418.super_ProString.m_string.d.d !=
                          (QMakeProject *)0x0) {
                        LOCK();
                        *(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)
                                  &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                  m_caller)->d =
                             *(int *)&((DataPointer *)
                                      &((QMakeEvaluator *)
                                       &(local_418.super_ProString.m_string.d.d)->super_QArrayData)
                                       ->m_caller)->d + -1;
                        UNLOCK();
                        if (*(int *)&((DataPointer *)
                                     &((QMakeEvaluator *)
                                      &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                      m_caller)->d == 0) {
                          QArrayData::deallocate
                                    (&(local_418.super_ProString.m_string.d.d)->super_QArrayData,2,
                                     0x10);
                        }
                      }
                    }
                    if ((QMakeProject *)local_3e8.d.d != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_3e8.d.d)->super_QArrayData)->m_caller)->d
                           = *(int *)&((DataPointer *)
                                      &((QMakeEvaluator *)&(local_3e8.d.d)->super_QArrayData)->
                                       m_caller)->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)
                                   &((QMakeEvaluator *)&(local_3e8.d.d)->super_QArrayData)->m_caller
                                   )->d == 0) {
                        QArrayData::deallocate(&(local_3e8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_358.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_358.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_358.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    QFileInfo::~QFileInfo((QFileInfo *)local_488);
                    if ((QMakeProject *)local_2f8._0_8_ != (QMakeProject *)0x0) {
                      LOCK();
                      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2f8._0_8_)->m_caller)->d =
                           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2f8._0_8_)->m_caller)
                                    ->d + -1;
                      UNLOCK();
                      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2f8._0_8_)->m_caller)->
                                   d == 0) {
                        QArrayData::deallocate((QArrayData *)local_2f8._0_8_,2,0x10);
                      }
                    }
                    pQVar34 = (QMakeProject *)
                              ((long)&((DataPointer *)&(pQVar34->super_QMakeEvaluator).m_caller)->d
                              + 1);
                    lVar35 = lVar35 + 0x18;
                  } while (pQVar34 < local_2c8);
                }
                QArrayDataPointer<QString>::~QArrayDataPointer
                          ((QArrayDataPointer<QString> *)(local_2f8 + 0x20));
                if (&(local_2b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_2b8.d.d)->super_QArrayData,2,0x10);
                  }
                }
              }
              else {
                local_500._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_310 = (QMakeProject *)local_238.d.d;
                local_308 = (Data *)local_238.d.ptr;
                QStack_300.d.ptr =
                     (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                      )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                        )local_238.d.size;
                if ((QMakeProject *)local_238.d.d != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)
                           &((QMakeEvaluator *)&(local_238.d.d)->super_QArrayData)->m_caller)->d =
                       *(int *)&((DataPointer *)
                                &((QMakeEvaluator *)&(local_238.d.d)->super_QArrayData)->m_caller)->
                                d + 1;
                  UNLOCK();
                }
                file_00.d.ptr = (char16_t *)pQVar33;
                file_00.d.d = (Data *)pMVar29;
                file_00.d.size = (qsizetype)pQVar25;
                fileInfo((MakefileGenerator *)local_500,file_00);
                in_stack_fffffffffffffa58 = pQVar25;
                if (local_310 != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&(local_310->super_QMakeEvaluator).m_caller)->d =
                       *(int *)&((DataPointer *)&(local_310->super_QMakeEvaluator).m_caller)->d + -1
                  ;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&(local_310->super_QMakeEvaluator).m_caller)->d == 0)
                  {
                    pcVar30 = (char *)0x2;
                    QArrayData::deallocate((QArrayData *)local_310,2,0x10);
                    in_stack_fffffffffffffa58 = pQVar25;
                  }
                }
                local_2b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_2b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_2b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                filePrefixRoot(&local_2b8,(MakefileGenerator *)pcVar30,&local_148,
                               (QString *)local_298);
                cVar13 = QString::endsWith((QString *)&local_2b8,0x2e2bf0);
                if (cVar13 == '\0') {
                  QString::append((QString *)&local_2b8);
                }
                QFileInfo::fileName();
                QString::append((QString *)&local_2b8);
                if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d +
                       -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d ==
                      0) {
                    QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                  }
                }
                local_2f8._32_8_ = (Data *)0x0;
                QStack_2d0.d = (Data *)0x0;
                local_2c8 = (QMakeProject *)0x0;
                if ((cVar11 == '\0') &&
                   ((cVar11 = QFileInfo::isDir(), cVar11 != '\0' ||
                    (cVar11 = QFileInfo::isExecutable(), cVar11 == '\0')))) {
                  qVar18 = 0xb;
                  pcVar30 = "$(QINSTALL)";
                }
                else {
                  qVar18 = 0x13;
                  pcVar30 = "$(QINSTALL_PROGRAM)";
                }
                QVar54.m_data = pcVar30;
                QVar54.m_size = qVar18;
                QString::operator=((QString *)(local_2f8 + 0x20),QVar54);
                (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                          (local_398,pMVar29,&local_238);
                uVar8 = local_398._16_8_;
                uVar7 = local_398._8_8_;
                uVar6 = local_398._0_8_;
                local_398._16_8_ = (QMakeProject *)0x0;
                local_398._0_8_ = (QMakeProject *)0x0;
                local_398._8_8_ = (QMakeProject *)0x0;
                (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                          (&local_3c8,pMVar29,&local_2b8);
                local_50 = (QMakeProject *)local_3c8.a.d.size;
                PStack_58.d.d.ptr =
                     (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                      )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                        )local_3c8.a.d.ptr;
                local_60 = (QMakeProject *)local_3c8.a.d.d;
                local_88._0_8_ = " ";
                local_88._8_8_ = uVar6;
                local_78.d = (Data *)uVar7;
                pQStack_70 = (QMakeProject *)uVar8;
                pQStack_68 = (QMakeProject *)0x2adf3e;
                local_3c8.a.d.d = (Data *)0x0;
                local_3c8.a.d.ptr = (char16_t *)0x0;
                local_3c8.a.d.size = 0;
                ::operator+=((QString *)(local_2f8 + 0x20),
                             (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                              *)local_88);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                                   *)local_88);
                if ((QMakeProject *)local_3c8.a.d.d != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)
                           &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)->d =
                       *(int *)&((DataPointer *)
                                &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)
                                ->d + -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)
                               ->d == 0) {
                    QArrayData::deallocate(&(local_3c8.a.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QMakeProject *)local_398._0_8_ != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d +
                       -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d ==
                      0) {
                    QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
                  }
                }
                local_2f8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_2f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_2f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                ProKey::ProKey((ProKey *)local_88,"QMAKE_INSTALL_REPLACE");
                QFileInfo::fileName();
                createSedArgs((QString *)local_2f8,pMVar29,(ProKey *)local_88,(QString *)local_398);
                if ((QMakeProject *)local_398._0_8_ != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d +
                       -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d ==
                      0) {
                    QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
                  }
                }
                if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                  LOCK();
                  ((__atomic_base<int> *)&(((QString *)local_88._0_8_)->d).d)->_M_i =
                       ((__atomic_base<int> *)&(((QString *)local_88._0_8_)->d).d)->_M_i + -1;
                  UNLOCK();
                  if (((__atomic_base<int> *)&(((QString *)local_88._0_8_)->d).d)->_M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                  }
                }
                if ((QMakeProject *)local_2f8._16_8_ == (QMakeProject *)0x0) {
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,
                             (QString *)(local_2f8 + 0x20));
                  QList<QString>::end((QList<QString> *)&local_1a8);
                }
                else {
                  (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                            (&local_3c8,pMVar29,&local_238);
                  qVar18 = local_3c8.a.d.size;
                  pcVar5 = local_3c8.a.d.ptr;
                  pDVar4 = local_3c8.a.d.d;
                  local_3c8.a.d.size = 0;
                  local_3c8.a.d.d = (Data *)0x0;
                  local_3c8.a.d.ptr = (char16_t *)0x0;
                  (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                            (&local_418,pMVar29,&local_2b8);
                  local_40 = (QMakeProject *)local_418.super_ProString.m_string.d.size;
                  pQStack_48 = (QMakeProject *)local_418.super_ProString.m_string.d.ptr;
                  local_50 = (QMakeProject *)local_418.super_ProString.m_string.d.d;
                  local_88._0_8_ = "$(SED) ";
                  local_88._8_8_ = local_2f8;
                  local_78.d._0_1_ = 0x20;
                  pQStack_70 = (QMakeProject *)pDVar4;
                  pQStack_68 = (QMakeProject *)pcVar5;
                  local_60 = (QMakeProject *)qVar18;
                  PStack_58.d.d.ptr =
                       (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                        )((long)"\n\techo \"// Automatically generated, do not modify\" > " + 0x32);
                  local_418.super_ProString.m_string.d.d = (Data *)0x0;
                  local_418.super_ProString.m_string.d.ptr = (char16_t *)0x0;
                  local_418.super_ProString.m_string.d.size = 0;
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
                  ::convertTo<QString>
                            ((QString *)local_398,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
                              *)local_88);
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                            ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,
                             (QString *)local_398);
                  QList<QString>::end((QList<QString> *)&local_1a8);
                  if ((QMakeProject *)local_398._0_8_ != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d =
                         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d
                         + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d
                        == 0) {
                      QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
                                     *)local_88);
                  if ((QMakeProject *)local_418.super_ProString.m_string.d.d != (QMakeProject *)0x0)
                  {
                    LOCK();
                    *(int *)&((DataPointer *)
                             &((QMakeEvaluator *)
                              &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller
                             )->d =
                         *(int *)&((DataPointer *)
                                  &((QMakeEvaluator *)
                                   &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                   m_caller)->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)
                                  &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                  m_caller)->d == 0) {
                      QArrayData::deallocate
                                (&(local_418.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
                      ;
                    }
                  }
                  if ((QMakeProject *)local_3c8.a.d.d != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)
                             &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)->d
                         = *(int *)&((DataPointer *)
                                    &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->
                                     m_caller)->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller
                                 )->d == 0) {
                      QArrayData::deallocate(&(local_3c8.a.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
                bVar1 = 1;
                if (bVar15) {
LAB_0016aea7:
                  bVar14 = false;
                  bVar12 = false;
                }
                else {
                  pQVar25 = pMVar29->project;
                  QVar46.m_data = (storage_type *)0xa;
                  QVar46.m_size = (qsizetype)local_88;
                  QString::fromUtf8(QVar46);
                  local_520 = (ProString *)local_88._0_8_;
                  config_02.m_data = (storage_type_conflict *)local_88._8_8_;
                  config_02.m_size = (qsizetype)local_78.d;
                  bVar14 = QMakeEvaluator::isActiveConfig
                                     (&pQVar25->super_QMakeEvaluator,config_02,false);
                  if (bVar14) goto LAB_0016aea7;
                  pQVar25 = pMVar29->project;
                  QVar41.m_data = (storage_type *)0x7;
                  QVar41.m_size = (qsizetype)local_88;
                  QString::fromUtf8(QVar41);
                  local_590 = (ProString *)local_88._0_8_;
                  config.m_data = (storage_type_conflict *)local_88._8_8_;
                  config.m_size = (qsizetype)local_78.d;
                  bVar14 = QMakeEvaluator::isActiveConfig
                                     (&pQVar25->super_QMakeEvaluator,config,false);
                  pMVar29 = this;
                  if ((bVar14) || (cVar11 = QFileInfo::isDir(), pMVar29 = this, cVar11 != '\0')) {
                    bVar1 = 0;
                    bVar14 = false;
                    bVar12 = false;
                    this = pMVar29;
                  }
                  else {
                    cVar11 = QFileInfo::isExecutable();
                    if (cVar11 == '\0') {
                      bVar1 = 0;
                      bVar14 = false;
                      bVar12 = false;
                      this = pMVar29;
                    }
                    else {
                      pQVar25 = pMVar29->project;
                      ProKey::ProKey(&local_340,"QMAKE_STRIP");
                      this = pMVar29;
                      bVar12 = QMakeProject::isEmpty(pQVar25,&local_340);
                      bVar12 = !bVar12;
                      bVar14 = true;
                      bVar1 = 0;
                    }
                  }
                }
                if ((bVar14) &&
                   (&(local_340.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0
                   )) {
                  LOCK();
                  ((local_340.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_340.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_340.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(local_340.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (!(bool)(bVar1 | local_590 == (ProString *)0x0)) {
                  LOCK();
                  ((__atomic_base<int> *)&(local_590->m_string).d.d)->_M_i =
                       ((__atomic_base<int> *)&(local_590->m_string).d.d)->_M_i + -1;
                  UNLOCK();
                  if (((__atomic_base<int> *)&(local_590->m_string).d.d)->_M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_590,2,0x10);
                  }
                }
                if (!bVar15 && local_520 != (ProString *)0x0) {
                  LOCK();
                  ((__atomic_base<int> *)&(local_520->m_string).d.d)->_M_i =
                       ((__atomic_base<int> *)&(local_520->m_string).d.d)->_M_i + -1;
                  UNLOCK();
                  if (((__atomic_base<int> *)&(local_520->m_string).d.d)->_M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_520,2,0x10);
                  }
                }
                if (bVar12) {
                  QVar47.m_data = (storage_type *)0x1;
                  QVar47.m_size = (qsizetype)local_88;
                  QString::fromUtf8(QVar47);
                  QVar10.d = local_78.d;
                  uVar7 = local_88._8_8_;
                  uVar6 = local_88._0_8_;
                  ProKey::ProKey(&local_418,"QMAKE_STRIP");
                  (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                            (&local_3e8,pMVar29,&local_418);
                  local_370 = (QMakeProject *)local_3e8.d.size;
                  pQStack_378 = (QMakeProject *)local_3e8.d.ptr;
                  local_380 = local_3e8.d.d;
                  local_3e8.d.d = (Data *)0x0;
                  local_3e8.d.ptr = (char16_t *)0x0;
                  local_3e8.d.size = 0;
                  local_3c8.a.d.d = (Data *)0x0;
                  local_398._0_8_ = uVar6;
                  local_398._8_8_ = uVar7;
                  local_3c8.a.d.ptr = (char16_t *)0x0;
                  local_3c8.a.d.size = 0;
                  local_398._16_8_ = QVar10.d;
                  local_3c8.b.d.d = (Data *)0x0;
                  local_3c8.b.d.ptr = (char16_t *)0x0;
                  local_3c8.b.d.size = 0;
                  QStack_368.d.ptr =
                       (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                        )(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                          *)0x2adf3e;
                  local_4e8.d.d = (Data *)local_298;
                  local_4e8.d.ptr = (char16_t *)local_278;
                  QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                            ((QString *)(local_488 + 8),
                             (QStringBuilder<QString_&,_QString_&> *)&local_4e8);
                  pMVar28 = pMVar29;
                  fileFixify(&local_468,pMVar29,(QString *)(local_488 + 8),(FileFixifyTypes)0x4,
                             false);
                  filePrefixRoot(&local_450,pMVar28,&local_148,&local_468);
                  (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                            (&local_438,pMVar29,&local_450);
                  local_60 = local_370;
                  pQStack_68 = pQStack_378;
                  pQStack_70 = (QMakeProject *)local_380;
                  local_78.d = (Data *)local_398._16_8_;
                  local_88._8_8_ = local_398._8_8_;
                  local_88._0_8_ = local_398._0_8_;
                  local_40 = (QMakeProject *)local_438.d.size;
                  pQStack_48 = (QMakeProject *)local_438.d.ptr;
                  local_50 = (QMakeProject *)local_438.d.d;
                  local_398._0_8_ = (QMakeProject *)0x0;
                  local_398._8_8_ = (QMakeProject *)0x0;
                  local_398._16_8_ = (QMakeProject *)0x0;
                  local_380 = (Data *)0x0;
                  pQStack_378 = (QMakeProject *)0x0;
                  local_370 = (QMakeProject *)0x0;
                  PStack_58.d.d.ptr =
                       (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                        )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                          )QStack_368.d.ptr;
                  local_438.d.d = (Data *)0x0;
                  local_438.d.ptr = (char16_t *)0x0;
                  local_438.d.size = 0;
                  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                  ::convertTo<QString>
                            (&local_358,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                              *)local_88);
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                            ((QMovableArrayOps<QString> *)&local_1a8,local_1a8.size,&local_358);
                  QList<QString>::end((QList<QString> *)&local_1a8);
                  if (&(local_358.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_358.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_358.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                                     *)local_88);
                  if ((Data *)local_438.d.d != (Data *)0x0) {
                    LOCK();
                    ((local_438.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_438.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_438.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_438.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QMakeProject *)local_450.d.d != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)
                             &((QMakeEvaluator *)&(local_450.d.d)->super_QArrayData)->m_caller)->d =
                         *(int *)&((DataPointer *)
                                  &((QMakeEvaluator *)&(local_450.d.d)->super_QArrayData)->m_caller)
                                  ->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)&(local_450.d.d)->super_QArrayData)->m_caller)
                                 ->d == 0) {
                      QArrayData::deallocate(&(local_450.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QMakeProject *)local_468.d.d != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)
                             &((QMakeEvaluator *)&(local_468.d.d)->super_QArrayData)->m_caller)->d =
                         *(int *)&((DataPointer *)
                                  &((QMakeEvaluator *)&(local_468.d.d)->super_QArrayData)->m_caller)
                                  ->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)&(local_468.d.d)->super_QArrayData)->m_caller)
                                 ->d == 0) {
                      QArrayData::deallocate(&(local_468.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((Data *)local_488._8_8_ != (Data *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_488._8_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_488._8_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_488._8_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_488._8_8_,2,0x10);
                    }
                  }
                  QStringBuilder<QString,_QString>::~QStringBuilder
                            ((QStringBuilder<QString,_QString> *)local_398);
                  QStringBuilder<QString,_QString>::~QStringBuilder(&local_3c8);
                  if ((QMakeProject *)local_3e8.d.d != (QMakeProject *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)
                             &((QMakeEvaluator *)&(local_3e8.d.d)->super_QArrayData)->m_caller)->d =
                         *(int *)&((DataPointer *)
                                  &((QMakeEvaluator *)&(local_3e8.d.d)->super_QArrayData)->m_caller)
                                  ->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)&(local_3e8.d.d)->super_QArrayData)->m_caller)
                                 ->d == 0) {
                      QArrayData::deallocate(&(local_3e8.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QMakeProject *)local_418.super_ProString.m_string.d.d != (QMakeProject *)0x0)
                  {
                    LOCK();
                    *(int *)&((DataPointer *)
                             &((QMakeEvaluator *)
                              &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller
                             )->d =
                         *(int *)&((DataPointer *)
                                  &((QMakeEvaluator *)
                                   &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                   m_caller)->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)
                                 &((QMakeEvaluator *)
                                  &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                  m_caller)->d == 0) {
                      QArrayData::deallocate
                                (&(local_418.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
                      ;
                    }
                  }
                }
                local_438.d.d = (Data *)local_298;
                local_438.d.ptr = (char16_t *)local_278;
                QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                          (&local_3e8,(QStringBuilder<QString_&,_QString_&> *)&local_438);
                pMVar28 = pMVar29;
                fileFixify(&local_358,pMVar29,&local_3e8,(FileFixifyTypes)0x4,false);
                filePrefixRoot((QString *)&local_418,pMVar28,&local_148,&local_358);
                (*(pMVar29->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                          (&local_3c8,pMVar29,&local_418);
                pQStack_68 = (QMakeProject *)local_3c8.a.d.size;
                pQStack_70 = (QMakeProject *)local_3c8.a.d.ptr;
                local_78.d = (Data *)local_3c8.a.d.d;
                local_88._0_8_ = local_a8;
                local_88._8_8_ = " ";
                local_3c8.a.d.d = (Data *)0x0;
                local_3c8.a.d.ptr = (char16_t *)0x0;
                local_3c8.a.d.size = 0;
                QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>::
                convertTo<QString>((QString *)local_398,
                                   (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>
                                    *)local_88);
                QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                          ((QMovableArrayOps<QString> *)&local_1c8,local_1c8.size,
                           (QString *)local_398);
                QList<QString>::end((QList<QString> *)&local_1c8);
                if ((QMakeProject *)local_398._0_8_ != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d +
                       -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d ==
                      0) {
                    QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
                  }
                }
                pQVar25 = in_stack_fffffffffffffa58;
                if ((QMakeProject *)local_78.d != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_78.d)->ref)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_78.d)->ref)->m_caller)->
                                d + -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_78.d)->ref)->m_caller)->d
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_78.d,2,0x10);
                  }
                }
                if ((QMakeProject *)local_3c8.a.d.d != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)
                           &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)->d =
                       *(int *)&((DataPointer *)
                                &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)
                                ->d + -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_3c8.a.d.d)->super_QArrayData)->m_caller)
                               ->d == 0) {
                    QArrayData::deallocate(&(local_3c8.a.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QMakeProject *)local_418.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)
                           &((QMakeEvaluator *)
                            &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)
                           ->d = *(int *)&((DataPointer *)
                                          &((QMakeEvaluator *)
                                           &(local_418.super_ProString.m_string.d.d)->
                                            super_QArrayData)->m_caller)->d + -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)
                               &((QMakeEvaluator *)
                                &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                m_caller)->d == 0) {
                    QArrayData::deallocate
                              (&(local_418.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_358.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_358.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QMakeProject *)local_3e8.d.d != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)
                           &((QMakeEvaluator *)&(local_3e8.d.d)->super_QArrayData)->m_caller)->d =
                       *(int *)&((DataPointer *)
                                &((QMakeEvaluator *)&(local_3e8.d.d)->super_QArrayData)->m_caller)->
                                d + -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&(local_3e8.d.d)->super_QArrayData)->m_caller)->d
                      == 0) {
                    QArrayData::deallocate(&(local_3e8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QMakeProject *)local_2f8._0_8_ != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2f8._0_8_)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2f8._0_8_)->m_caller)->d +
                       -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2f8._0_8_)->m_caller)->d ==
                      0) {
                    QArrayData::deallocate((QArrayData *)local_2f8._0_8_,2,0x10);
                  }
                }
                if ((Data *)local_2f8._32_8_ != (Data *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_2f8._32_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_2f8._32_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_2f8._32_8_)->_q_value).super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_2f8._32_8_,2,0x10);
                  }
                }
                if (&(local_2b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_2b8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QFileInfo::~QFileInfo((QFileInfo *)local_500);
              }
              if ((QMakeProject *)local_298._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_298._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_298._0_8_)->m_caller)->d +
                     -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_298._0_8_)->m_caller)->d == 0
                   ) {
                  QArrayData::deallocate((QArrayData *)local_298._0_8_,2,0x10);
                }
              }
              if ((QMakeProject *)local_278._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_278._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_278._0_8_)->m_caller)->d +
                     -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_278._0_8_)->m_caller)->d == 0
                   ) {
                  QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
                }
              }
              if ((QMakeProject *)local_258._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_258._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_258._0_8_)->m_caller)->d +
                     -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_258._0_8_)->m_caller)->d == 0
                   ) {
                  QArrayData::deallocate((QArrayData *)local_258._0_8_,2,0x10);
                }
              }
              if ((QMakeProject *)local_238.d.d != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)
                         &((QMakeEvaluator *)&(local_238.d.d)->super_QArrayData)->m_caller)->d =
                     *(int *)&((DataPointer *)
                              &((QMakeEvaluator *)&(local_238.d.d)->super_QArrayData)->m_caller)->d
                     + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)
                             &((QMakeEvaluator *)&(local_238.d.d)->super_QArrayData)->m_caller)->d
                    == 0) {
                  QArrayData::deallocate(&(local_238.d.d)->super_QArrayData,2,0x10);
                }
              }
              iVar20.i = iVar20.i + 1;
              iVar21 = QList<QString>::end((QList<QString> *)&local_188);
            } while (iVar20.i != iVar21.i);
          }
          if ((QMakeProject *)local_218.d.d != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)
                     &((QMakeEvaluator *)&(local_218.d.d)->super_QArrayData)->m_caller)->d =
                 *(int *)&((DataPointer *)
                          &((QMakeEvaluator *)&(local_218.d.d)->super_QArrayData)->m_caller)->d + -1
            ;
            UNLOCK();
            if (*(int *)&((DataPointer *)
                         &((QMakeEvaluator *)&(local_218.d.d)->super_QArrayData)->m_caller)->d == 0)
            {
              QArrayData::deallocate(&(local_218.d.d)->super_QArrayData,2,0x10);
            }
          }
LAB_0016b66b:
          local_398._16_8_ = (QMakeProject *)0x0;
          local_398._8_8_ = (QMakeProject *)0x0;
          local_398._0_8_ = (QMakeProject *)0x0;
          QVar48.m_data = (storage_type *)0x2;
          QVar48.m_size = (qsizetype)local_88;
          QString::fromUtf8(QVar48);
          uVar6 = local_88._0_8_;
          pQVar25 = (QMakeProject *)local_88._8_8_;
          if ((QMakeProject *)local_88._8_8_ == (QMakeProject *)0x0) {
            pQVar25 = (QMakeProject *)&QString::_empty;
          }
          QtPrivate::QStringList_join((QList *)local_88,(QChar *)&local_1a8,(longlong)pQVar25);
          QVar10.d = local_78.d;
          uVar9 = local_88._0_8_;
          uVar8 = local_398._8_8_;
          uVar7 = local_398._0_8_;
          local_88._0_8_ = local_398._0_8_;
          local_398._0_8_ = uVar9;
          local_398._8_8_ = local_88._8_8_;
          local_88._8_8_ = uVar8;
          local_78.d = (Data *)local_398._16_8_;
          local_398._16_8_ = QVar10.d;
          if ((QMakeProject *)uVar7 != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar7)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar7)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar7)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)uVar7,2,0x10);
            }
          }
          if ((QMakeProject *)uVar6 != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
            }
          }
        }
        local_3c8.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_3c8.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_3c8.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar25 = pMVar29->project;
        local_418.super_ProString.m_string.d.ptr = L".uninstall";
        local_418.super_ProString.m_string.d.d = (Data *)pQVar33;
        ProString::ProString<ProString_const&,char_const(&)[11]>
                  ((ProString *)local_88,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[11]> *)&local_418);
        pPVar19 = QMakeEvaluator::valuesRef(&pQVar25->super_QMakeEvaluator,(ProKey *)local_88);
        ProStringList::join(&local_3c8.a,pPVar19,(QChar)0x20);
        if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if ((char16_t *)local_3c8.a.d.size != (char16_t *)0x0) {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&local_1c8,local_1c8.size,&local_3c8.a);
          QList<QString>::end((QList<QString> *)&local_1c8);
        }
        pMVar28 = this;
        pQVar25 = pQVar33;
        if (((QMakeProject *)local_398._16_8_ == (QMakeProject *)0x0) &&
           (qVar18 = QtPrivate::indexOf<ProString,char[14]>(vector,(char (*) [14])"dummy_install",0)
           , pQVar25 = pQVar33, qVar18 == -1)) {
          if (Option::debug_level != 0) {
            ProString::toLatin1((QByteArray *)local_88,(ProString *)pQVar33);
            pQVar25 = (QMakeProject *)local_88._8_8_;
            if ((QMakeProject *)local_88._8_8_ == (QMakeProject *)0x0) {
              pQVar25 = (QMakeProject *)&QByteArray::_empty;
            }
            debug_msg_internal(1,"no definition for install %s: install target not created",pQVar25)
            ;
            if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
              }
            }
          }
        }
        else {
          if ((noBuild) ||
             (qVar18 = QtPrivate::indexOf<ProString,char[9]>(vector,(char (*) [9])"no_build",0),
             qVar18 != -1)) {
            pQVar24 = (QTextStream *)QTextStream::operator<<(t,anon_var_dwarf_156f5d + 2);
            pQVar33 = pQVar25;
            pQVar24 = operator<<(pQVar24,(ProString *)pQVar25);
            QTextStream::operator<<(pQVar24,":");
          }
          else {
            pQVar33 = this->project;
            QVar50.m_data = (storage_type *)0x9;
            QVar50.m_size = (qsizetype)local_88;
            QString::fromUtf8(QVar50);
            uVar6 = local_88._0_8_;
            config_03.m_data = (storage_type_conflict *)local_88._8_8_;
            config_03.m_size = (qsizetype)local_78.d;
            bVar15 = QMakeEvaluator::isActiveConfig(&pQVar33->super_QMakeEvaluator,config_03,false);
            this = pMVar28;
            if ((QMakeProject *)uVar6 != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar6)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
                this = pMVar28;
              }
            }
            pQVar24 = (QTextStream *)QTextStream::operator<<(t,anon_var_dwarf_156f5d + 2);
            pQVar24 = operator<<(pQVar24,(ProString *)pQVar25);
            if (bVar15) {
              pcVar30 = ": all";
            }
            else {
              pcVar30 = ": first";
            }
            QTextStream::operator<<(pQVar24,pcVar30);
            pMVar28 = this;
            pQVar33 = pQVar25;
          }
          pQVar34 = this->project;
          local_418.super_ProString.m_string.d.ptr = L".depends";
          local_418.super_ProString.m_string.d.d = (Data *)pQVar25;
          ProString::ProString<ProString_const&,char_const(&)[9]>
                    ((ProString *)local_88,
                     (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)&local_418);
          pPVar19 = QMakeEvaluator::valuesRef(&pQVar34->super_QMakeEvaluator,(ProKey *)local_88);
          this = pMVar28;
          if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              this = pMVar28;
            }
          }
          if (((pPVar19->super_QList<ProString>).d.size != 0) &&
             ((pPVar19->super_QList<ProString>).d.size != 0)) {
            pQVar25 = (QMakeProject *)(pPVar19->super_QList<ProString>).d.ptr;
            do {
              local_418.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_418.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_418.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              local_218.d.ptr = L".target";
              pMVar28 = this;
              local_218.d.d = (Data *)pQVar25;
              ProString::ProString<ProString_const&,char_const(&)[8]>
                        ((ProString *)local_88,
                         (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_218);
              (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                        (&local_418,this,(ProString *)local_88);
              this = pMVar28;
              if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1
                ;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0)
                {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                  this = pMVar28;
                }
              }
              if ((QMakeProject *)local_418.super_ProString.m_string.d.size == (QMakeProject *)0x0)
              {
                ProString::toQString((QString *)local_88,(ProString *)pQVar25);
                QVar10.d = local_78.d;
                uVar6 = local_88._0_8_;
                pcVar5 = local_418.super_ProString.m_string.d.ptr;
                pDVar4 = local_418.super_ProString.m_string.d.d;
                local_88._0_8_ = local_418.super_ProString.m_string.d.d;
                pQVar32 = (QMakeProject *)local_418.super_ProString.m_string.d.ptr;
                pQVar2 = (QMakeProject *)local_418.super_ProString.m_string.d.size;
                local_418.super_ProString.m_string.d.d = (Data *)uVar6;
                local_418.super_ProString.m_string.d.ptr = (char16_t *)local_88._8_8_;
                pQVar34 = (QMakeProject *)local_78.d;
                local_88._8_8_ = pcVar5;
                local_78.d = (Data *)local_418.super_ProString.m_string.d.size;
                local_418.super_ProString.m_string.d.size = (qsizetype)QVar10.d;
                if ((QMakeProject *)pDVar4 != (QMakeProject *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)
                           ->d = *(int *)&((DataPointer *)
                                          &((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)
                                          ->d + -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)
                               &((QMakeEvaluator *)&pDVar4->super_QArrayData)->m_caller)->d == 0) {
                    QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
                  }
                }
              }
              pQVar24 = (QTextStream *)QTextStream::operator<<(t," ");
              (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                        (local_88,this,&local_418);
              QTextStream::operator<<(pQVar24,(QString *)local_88);
              if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1
                ;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0)
                {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              if ((QMakeProject *)local_418.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)
                         &((QMakeEvaluator *)
                          &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d
                     = *(int *)&((DataPointer *)
                                &((QMakeEvaluator *)
                                 &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                 m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)
                             &((QMakeEvaluator *)
                              &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller
                             )->d == 0) {
                  QArrayData::deallocate
                            (&(local_418.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              pQVar25 = (QMakeProject *)
                        &(pQVar25->super_QMakeEvaluator).m_locationStack.
                         super_QList<QMakeEvaluator::Location>.d.size;
            } while (pQVar25 !=
                     (QMakeProject *)
                     ((pPVar19->super_QList<ProString>).d.ptr +
                     (pPVar19->super_QList<ProString>).d.size));
          }
          pMVar28 = this;
          QTextStream::operator<<(t," FORCE\n\t");
          pPVar19 = QMakeEvaluator::valuesRef
                              (&this->project->super_QMakeEvaluator,(ProKey *)local_128);
          if ((pPVar19->super_QList<ProString>).d.size != 0) {
            this_00 = (pPVar19->super_QList<ProString>).d.ptr;
            do {
              local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              ProString::toQString((QString *)&local_418,this_00);
              pMVar29 = this;
              fileFixify((QString *)local_88,this,(QString *)&local_418,(FileFixifyTypes)0x4,false);
              if ((QMakeProject *)local_418.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)
                         &((QMakeEvaluator *)
                          &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d
                     = *(int *)&((DataPointer *)
                                &((QMakeEvaluator *)
                                 &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                 m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)
                             &((QMakeEvaluator *)
                              &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller
                             )->d == 0) {
                  pMVar29 = (MakefileGenerator *)0x2;
                  QArrayData::deallocate
                            (&(local_418.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              filePrefixRoot(&local_218,pMVar29,&local_148,(QString *)local_88);
              mkdir_p_asstring((QString *)&local_418,this,&local_218,true);
              pQVar24 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_418);
              QTextStream::operator<<(pQVar24,"\n\t");
              if ((QMakeProject *)local_418.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)
                         &((QMakeEvaluator *)
                          &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d
                     = *(int *)&((DataPointer *)
                                &((QMakeEvaluator *)
                                 &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->
                                 m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)
                             &((QMakeEvaluator *)
                              &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller
                             )->d == 0) {
                  QArrayData::deallocate
                            (&(local_418.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QMakeProject *)local_218.d.d != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)
                         &((QMakeEvaluator *)&(local_218.d.d)->super_QArrayData)->m_caller)->d =
                     *(int *)&((DataPointer *)
                              &((QMakeEvaluator *)&(local_218.d.d)->super_QArrayData)->m_caller)->d
                     + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)
                             &((QMakeEvaluator *)&(local_218.d.d)->super_QArrayData)->m_caller)->d
                    == 0) {
                  QArrayData::deallocate(&(local_218.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1
                ;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0)
                {
                  QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                }
              }
              this_00 = this_00 + 1;
            } while (this_00 !=
                     (pPVar19->super_QList<ProString>).d.ptr +
                     (pPVar19->super_QList<ProString>).d.size);
          }
          pQVar24 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_398);
          pQVar24 = (QTextStream *)Qt::endl(pQVar24);
          Qt::endl(pQVar24);
          if ((Data *)local_1c8.size != (Data *)0x0) {
            pQVar24 = (QTextStream *)QTextStream::operator<<(t,anon_var_dwarf_156f5d);
            pQVar24 = operator<<(pQVar24,(ProString *)pQVar33);
            QTextStream::operator<<(pQVar24,": FORCE");
            this = pMVar28;
            if (0 < (int)(uint)local_1c8.size) {
              uVar26 = (ulong)((uint)local_1c8.size & 0x7fffffff);
              lVar27 = uVar26 + 1;
              lVar35 = uVar26 * 0x18;
              do {
                pQVar24 = (QTextStream *)QTextStream::operator<<(t,"\n\t");
                QTextStream::operator<<(pQVar24,(QString *)((long)&local_1c8.ptr[-1].d.d + lVar35));
                lVar27 = lVar27 + -1;
                lVar35 = lVar35 + -0x18;
              } while (1 < lVar27);
            }
            pcVar30 = "\n\t-$(DEL_DIR) ";
            pQVar24 = (QTextStream *)QTextStream::operator<<(t,"\n\t-$(DEL_DIR) ");
            filePrefixRoot((QString *)&local_418,(MakefileGenerator *)pcVar30,&local_148,&local_168)
            ;
            (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                      ((QStringBuilder<QStringBuilder<QString,_const_ProString_&>,_const_char_(&)[2]>
                        *)local_88,this,&local_418);
            pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,(QString *)local_88);
            QTextStream::operator<<(pQVar24," \n\n");
            if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              }
            }
            pMVar28 = this;
            if ((QMakeProject *)local_418.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)
                       &((QMakeEvaluator *)
                        &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d =
                   *(int *)&((DataPointer *)
                            &((QMakeEvaluator *)
                             &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)
                            ->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)
                           &((QMakeEvaluator *)
                            &(local_418.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)
                           ->d == 0) {
                QArrayData::deallocate
                          (&(local_418.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                pMVar28 = this;
              }
            }
          }
          Qt::endl(t);
          qVar18 = QtPrivate::indexOf<ProString,char[19]>
                             (vector,(char (*) [19])"no_default_install",0);
          if (qVar18 == -1) {
            QVar49.m_data = &DAT_00000008;
            QVar49.m_size = (qsizetype)local_88;
            QString::fromUtf8(QVar49);
            pQStack_68 = (QMakeProject *)0x2adf3e;
            pQStack_70 = pQVar33;
            ::operator+=(&local_c8,
                         (QStringBuilder<QStringBuilder<QString,_const_ProString_&>,_const_char_(&)[2]>
                          *)local_88);
            if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              }
            }
            if ((Data *)local_1c8.size != (Data *)0x0) {
              local_88._0_8_ = anon_var_dwarf_156f5d;
              local_78.d = (Data *)0x2adf3e;
              local_88._8_8_ = pQVar33;
              ::operator+=(&local_e8,
                           (QStringBuilder<QStringBuilder<const_char_(&)[11],_const_ProString_&>,_const_char_(&)[2]>
                            *)local_88);
            }
          }
        }
        if ((Data *)local_3c8.a.d.d != (Data *)0x0) {
          LOCK();
          ((local_3c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_3c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_3c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
             ) {
            QArrayData::deallocate(&(local_3c8.a.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QMakeProject *)local_398._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
          }
        }
        QArrayDataPointer<ProString>::~QArrayDataPointer(&local_1e8);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_1c8);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_1a8);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_188);
        if ((QMakeProject *)local_168.d.d != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_168.d.d)->super_QArrayData)->m_caller
                   )->d =
               *(int *)&((DataPointer *)
                        &((QMakeEvaluator *)&(local_168.d.d)->super_QArrayData)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)
                       &((QMakeEvaluator *)&(local_168.d.d)->super_QArrayData)->m_caller)->d == 0) {
            QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
          }
        }
        piVar3 = (int *)CONCAT44(local_148.d.d._4_4_,local_148.d.d._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            lVar31 = 2;
            pQVar25 = (QMakeProject *)CONCAT44(local_148.d.d._4_4_,local_148.d.d._0_4_);
            goto LAB_0016c191;
          }
        }
      }
      if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
        }
      }
      pQVar33 = (QMakeProject *)
                &(pQVar33->super_QMakeEvaluator).m_locationStack.
                 super_QList<QMakeEvaluator::Location>.d.size;
    } while (pQVar33 !=
             (QMakeProject *)
             ((pPVar17->super_QList<ProString>).d.ptr + (pPVar17->super_QList<ProString>).d.size));
  }
  pQVar24 = (QTextStream *)QTextStream::operator<<(t,"install:");
  ProKey::ProKey((ProKey *)local_88,"INSTALLDEPS");
  depVar((QString *)local_128,this,(ProKey *)local_88);
  pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,(QString *)local_128);
  pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,' ');
  pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,(QString *)&local_c8);
  pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24," FORCE\n\nuninstall: ");
  pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,(QString *)&local_e8);
  ProKey::ProKey((ProKey *)local_398,"UNINSTALLDEPS");
  depVar(&local_3c8.a,this,(ProKey *)local_398);
  pQVar24 = (QTextStream *)QTextStream::operator<<(pQVar24,(QString *)&local_3c8);
  QTextStream::operator<<(pQVar24," FORCE\n\n");
  if ((Data *)local_3c8.a.d.d != (Data *)0x0) {
    LOCK();
    ((local_3c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_3c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_3c8.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QMakeProject *)local_398._0_8_ != (QMakeProject *)0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_398._0_8_)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_398._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
    }
  }
  if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  QHash<QString,_QHashDummyValue>::~QHash(&local_f8);
  QHash<QString,_QHashDummyValue>::~QHash(&local_f0);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QMakeProject *)local_a8._0_8_ != (QMakeProject *)0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_a8._0_8_)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_a8._0_8_)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_a8._0_8_)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
MakefileGenerator::writeInstalls(QTextStream &t, bool noBuild)
{
    QString rm_dir_contents("-$(DEL_FILE)");
    if (!isWindowsShell()) //ick
        rm_dir_contents = "-$(DEL_FILE) -r";

    QString all_installs, all_uninstalls;
    QSet<QString> made_dirs, removed_dirs;
    const ProStringList &l = project->values("INSTALLS");
    for (ProStringList::ConstIterator it = l.begin(); it != l.end(); ++it) {
        const ProKey pvar(*it + ".path");
        const ProStringList &installConfigValues = project->values(ProKey(*it + ".CONFIG"));
        if (installConfigValues.indexOf("no_path") == -1 &&
            installConfigValues.indexOf("dummy_install") == -1 &&
           project->values(pvar).isEmpty()) {
            warn_msg(WarnLogic, "%s is not defined: install target not created\n", pvar.toLatin1().constData());
            continue;
        }

        bool do_default = true;
        const QString root = installRoot();
        QString dst;
        if (installConfigValues.indexOf("no_path") == -1 &&
            installConfigValues.indexOf("dummy_install") == -1) {
            dst = fileFixify(project->first(pvar).toQString(), FileFixifyAbsolute, false);
            if(!dst.endsWith(Option::dir_sep))
                dst += Option::dir_sep;
        }

        QStringList tmp, inst, uninst;
        //other
        ProStringList tmp2 = project->values(ProKey(*it + ".extra"));
        if (tmp2.isEmpty())
            tmp2 = project->values(ProKey(*it + ".commands")); //to allow compatible name
        if (!tmp2.isEmpty()) {
            do_default = false;
            inst << tmp2.join(' ');
        }
        //masks
        tmp2 = findFilesInVPATH(project->values(ProKey(*it + ".files")), VPATH_NoFixify);
        tmp = fileFixify(tmp2.toQStringList(), FileFixifyAbsolute);
        if(!tmp.isEmpty()) {
            do_default = false;
            QString base_path = project->first(ProKey(*it + ".base")).toQString();
            if (!base_path.isEmpty()) {
                base_path = Option::fixPathToTargetOS(base_path, false, true);
                if (!base_path.endsWith(Option::dir_sep))
                    base_path += Option::dir_sep;
            }
            for(QStringList::Iterator wild_it = tmp.begin(); wild_it != tmp.end(); ++wild_it) {
                QString wild = Option::fixPathToTargetOS((*wild_it), false, false);
                QString dirstr = qmake_getpwd(), filestr = wild;
                int slsh = filestr.lastIndexOf(Option::dir_sep);
                if(slsh != -1) {
                    dirstr = filestr.left(slsh+1);
                    filestr.remove(0, slsh+1);
                }
                if(!dirstr.endsWith(Option::dir_sep))
                    dirstr += Option::dir_sep;
                QString dst_dir = dst;
                if (!base_path.isEmpty()) {
                    if (!dirstr.startsWith(base_path)) {
                        warn_msg(WarnLogic, "File %s in install rule %s does not start with base %s",
                                            qPrintable(wild), qPrintable((*it).toQString()),
                                            qPrintable(base_path));
                    } else {
                        QString dir_sfx = dirstr.mid(base_path.size());
                        dst_dir += dir_sfx;
                        if (!dir_sfx.isEmpty() && !made_dirs.contains(dir_sfx)) {
                            made_dirs.insert(dir_sfx);
                            QString tmp_dst = fileFixify(dst_dir, FileFixifyAbsolute, false);
                            tmp_dst.chop(1);
                            inst << mkdir_p_asstring(filePrefixRoot(root, tmp_dst));
                            for (int i = dst.size(); i < dst_dir.size(); i++) {
                                if (dst_dir.at(i) == Option::dir_sep) {
                                    QString subd = dst_dir.left(i);
                                    if (!removed_dirs.contains(subd)) {
                                        removed_dirs.insert(subd);
                                        tmp_dst = fileFixify(subd, FileFixifyAbsolute, false);
                                        uninst << "-$(DEL_DIR) "
                                                  + escapeFilePath(filePrefixRoot(root, tmp_dst));
                                    }
                                }
                            }
                        }
                    }
                }
                bool is_target = (wild == fileFixify(var("TARGET"), FileFixifyAbsolute));
                const bool noStrip = installConfigValues.contains("nostrip");
                if(is_target || exists(wild)) { //real file or target
                    QFileInfo fi(fileInfo(wild));
                    QString dst_file = filePrefixRoot(root, dst_dir);
                    if (!dst_file.endsWith(Option::dir_sep))
                        dst_file += Option::dir_sep;
                    dst_file += fi.fileName();
                    QString cmd;
                    if (is_target || (!fi.isDir() && fi.isExecutable()))
                       cmd = QLatin1String("$(QINSTALL_PROGRAM)");
                    else
                       cmd = QLatin1String("$(QINSTALL)");
                    cmd += " " + escapeFilePath(wild) + " " + escapeFilePath(dst_file);

                    QString sedArgs = createSedArgs(ProKey("QMAKE_INSTALL_REPLACE"), fi.fileName());
                    if (!sedArgs.isEmpty())
                        inst << "$(SED) " + sedArgs + ' ' + escapeFilePath(wild) + " > "
                                        + escapeFilePath(dst_file);
                    else
                        inst << cmd;

                    if (!noStrip && !project->isActiveConfig("debug_info") && !project->isActiveConfig("nostrip") &&
                       !fi.isDir() && fi.isExecutable() && !project->isEmpty("QMAKE_STRIP"))
                        inst << QString("-") + var("QMAKE_STRIP") + " " +
                                  escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + filestr, FileFixifyAbsolute, false)));
                    uninst.append(rm_dir_contents + " " + escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + filestr, FileFixifyAbsolute, false))));
                    continue;
                }
                QString local_dirstr = Option::normalizePath(dirstr);
                QStringList files = QDir(local_dirstr).entryList(QStringList(filestr),
                                            QDir::NoDotAndDotDot | QDir::AllEntries);
                if (installConfigValues.contains("no_check_exist") && files.isEmpty()) {
                    QString dst_file = filePrefixRoot(root, dst_dir);
                    if (!dst_file.endsWith(Option::dir_sep))
                        dst_file += Option::dir_sep;
                    dst_file += filestr;
                    QString cmd;
                    if (installConfigValues.contains("executable"))
                        cmd = QLatin1String("$(QINSTALL_PROGRAM)");
                    else
                        cmd = QLatin1String("$(QINSTALL)");
                    cmd += " " + escapeFilePath(wild) + " " + escapeFilePath(dst_file);
                    inst << cmd;
                    uninst.append(rm_dir_contents + " " + escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + filestr, FileFixifyAbsolute, false))));
                }
                for(int x = 0; x < files.size(); x++) {
                    QString file = files[x];
                    uninst.append(rm_dir_contents + " " + escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + file, FileFixifyAbsolute, false))));
                    QFileInfo fi(fileInfo(dirstr + file));
                    QString dst_file = filePrefixRoot(root, fileFixify(dst_dir, FileFixifyAbsolute, false));
                    if (!dst_file.endsWith(Option::dir_sep))
                        dst_file += Option::dir_sep;
                    dst_file += fi.fileName();
                    QString cmd = QLatin1String("$(QINSTALL) ") +
                                  escapeFilePath(dirstr + file) + " " + escapeFilePath(dst_file);
                    inst << cmd;
                    if (!noStrip && !project->isActiveConfig("debug_info") && !project->isActiveConfig("nostrip") &&
                       !fi.isDir() && fi.isExecutable() && !project->isEmpty("QMAKE_STRIP"))
                        inst << QString("-") + var("QMAKE_STRIP") + " " +
                                  escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + file, FileFixifyAbsolute, false)));
                }
            }
        }
        QString target;
        //default?
        if (do_default)
            target = defaultInstall((*it).toQString());
        else
            target = inst.join("\n\t");
        QString puninst = project->values(ProKey(*it + ".uninstall")).join(' ');
        if (!puninst.isEmpty())
            uninst << puninst;

        if (!target.isEmpty() || installConfigValues.indexOf("dummy_install") != -1) {
            if (noBuild || installConfigValues.indexOf("no_build") != -1)
                t << "install_" << (*it) << ":";
            else if(project->isActiveConfig("build_all"))
                t << "install_" << (*it) << ": all";
            else
                t << "install_" << (*it) << ": first";
            const ProStringList &deps = project->values(ProKey(*it + ".depends"));
            if(!deps.isEmpty()) {
                for (ProStringList::ConstIterator dep_it = deps.begin(); dep_it != deps.end(); ++dep_it) {
                    QString targ = var(ProKey(*dep_it + ".target"));
                    if(targ.isEmpty())
                        targ = (*dep_it).toQString();
                    t << " " << escapeDependencyPath(targ);
                }
            }
            t << " FORCE\n\t";
            const ProStringList &dirs = project->values(pvar);
            for (ProStringList::ConstIterator pit = dirs.begin(); pit != dirs.end(); ++pit) {
                QString tmp_dst = fileFixify((*pit).toQString(), FileFixifyAbsolute, false);
                t << mkdir_p_asstring(filePrefixRoot(root, tmp_dst)) << "\n\t";
            }
            t << target << Qt::endl << Qt::endl;
            if(!uninst.isEmpty()) {
                t << "uninstall_" << (*it) << ": FORCE";
                for (int i = uninst.size(); --i >= 0; )
                    t << "\n\t" << uninst.at(i);
                t << "\n\t-$(DEL_DIR) " << escapeFilePath(filePrefixRoot(root, dst)) << " \n\n";
            }
            t << Qt::endl;

            if (installConfigValues.indexOf("no_default_install") == -1) {
                all_installs += QString("install_") + (*it) + " ";
                if(!uninst.isEmpty())
                    all_uninstalls += "uninstall_" + (*it) + " ";
            }
        }   else {
            debug_msg(1, "no definition for install %s: install target not created",(*it).toLatin1().constData());
        }
    }
    t << "install:" << depVar("INSTALLDEPS") << ' ' << all_installs
      << " FORCE\n\nuninstall: " << all_uninstalls << depVar("UNINSTALLDEPS")
      << " FORCE\n\n";
}